

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O3

void __thiscall
capnp::compiler::NodeTranslator::compileInterface
          (NodeTranslator *this,Reader decl,Reader members,Builder builder)

{
  RemoveConst<capnp::compiler::NodeTranslator::AuxNode> **ppRVar1;
  ushort uVar2;
  short sVar3;
  BrandedDecl *pBVar4;
  ArrayDisposer *pAVar5;
  long lVar6;
  Arena *pAVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  Builder target;
  Builder builder_00;
  Builder target_00;
  Builder target_01;
  Builder builder_01;
  Builder target_02;
  Builder target_03;
  Reader source;
  Reader ordinal;
  Reader params_00;
  Reader source_00;
  undefined1 auVar10 [40];
  Reader source_01;
  Reader params_01;
  Reader source_02;
  Reader source_03;
  Reader annotations;
  ImplicitParams implicitMethodParams;
  Reader name;
  Reader name_00;
  undefined1 auVar11 [56];
  undefined1 auVar12 [56];
  ListElementCount LVar13;
  CapTableBuilder *pCVar14;
  void *pvVar15;
  RemoveConst<capnp::compiler::BrandScope_*> *ppBVar16;
  BrandScope **ppBVar17;
  undefined1 auVar18 [8];
  word wVar19;
  word *pwVar20;
  word wVar21;
  CapTableBuilder *pCVar22;
  word *pwVar23;
  bool bVar24;
  undefined1 uVar25;
  undefined1 uVar26;
  undefined2 uVar27;
  uint uVar28;
  MemberInfo **ppMVar29;
  RemoveConst<capnp::compiler::NodeTranslator::StructTranslator::MemberInfo_*> *ppMVar30;
  MemberInfo **ppMVar31;
  long *plVar32;
  MemberInfo ***pppMVar33;
  undefined8 *puVar34;
  size_t *psVar35;
  _Rb_tree_node_base *p_Var36;
  StructDataBitCount SVar37;
  byte bVar38;
  PointerType PVar39;
  WireValue<uint32_t> WVar40;
  SegmentReader *pSVar41;
  long lVar42;
  _Base_ptr *pp_Var43;
  _Base_ptr p_Var44;
  WirePointer WVar45;
  WirePointer WVar46;
  WirePointer WVar47;
  SegmentBuilder *pSVar48;
  BrandScope **ppBVar49;
  WirePointer WVar50;
  WirePointer *pWVar51;
  WirePointer WVar52;
  RemoveConst<capnp::compiler::NodeTranslator::AuxNode> *pRVar53;
  WirePointer WVar54;
  _Base_ptr p_Var55;
  undefined4 uVar56;
  uint uVar57;
  uint32_t uVar58;
  _Base_ptr p_Var59;
  ArrayPtr<const_char> *pAVar60;
  WirePointer WVar61;
  _Base_ptr p_Var62;
  WirePointer WVar63;
  int iVar64;
  Reader *__range2;
  ulong uVar65;
  WirePointer WVar66;
  WirePointer WVar67;
  ErrorReporter *pEVar68;
  BrandScope *pBVar69;
  BrandScope *pBVar70;
  undefined4 uVar71;
  anon_union_4_5_35ddcec3_for_WirePointer_1 aVar72;
  size_t sVar73;
  MemberInfo *pMVar74;
  char *pcVar75;
  WirePointer parentId;
  WirePointer parentId_00;
  SegmentBuilder *pSVar76;
  WirePointer in_R8;
  WirePointer WVar77;
  undefined8 uVar78;
  anon_union_4_5_35ddcec3_for_WirePointer_1 aVar79;
  WireValue<uint32_t> WVar80;
  ulong uVar81;
  ulong uVar82;
  WirePointer WVar83;
  short *psVar84;
  unsigned_long i;
  ulong uVar85;
  ulong uVar86;
  ElementCount EVar87;
  ulong uVar88;
  bool bVar89;
  bool bVar90;
  uint uVar91;
  StringPtr targetsFlagName;
  Reader value;
  Reader RVar92;
  Reader superclass;
  Builder scope_1;
  Vector<capnp::compiler::BrandScope_*> levels_2;
  ArrayBuilder<capnp::compiler::BrandedDecl> implicitDecls;
  Vector<capnp::compiler::BrandScope_*> levels_1;
  Builder bindings_1;
  Own<capnp::compiler::BrandScope,_std::nullptr_t> brand;
  BuilderFor<capnp::schema::Node> builder_1;
  Builder scopes;
  String typeName;
  Vector<capnp::compiler::BrandScope_*> levels;
  Builder bindings;
  BuilderFor<capnp::schema::Node::SourceInfo> sourceInfoBuilder;
  DuplicateOrdinalDetector dupDetector;
  Builder methodBuilder;
  multimap<unsigned_int,_std::pair<unsigned_int,_capnp::compiler::Declaration::Reader>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::pair<unsigned_int,_capnp::compiler::Declaration::Reader>_>_>_>
  methods;
  Reader params;
  Builder s;
  Builder sourceInfo;
  Builder implicitsBuilder;
  Builder sourceInfoList;
  Builder list;
  Builder superclassesBuilder;
  Reader superclassesDecl;
  undefined8 uVar93;
  undefined8 uVar94;
  undefined2 uVar95;
  StructPointerCount SVar96;
  int6 iVar97;
  anon_union_4_5_35ddcec3_for_WirePointer_1 aVar98;
  PointerBuilder *this_00;
  CapTableBuilder **ppCVar99;
  _Base_ptr p_Var100;
  WireValue<uint32_t> in_stack_fffffffffffff758;
  anon_union_4_5_35ddcec3_for_WirePointer_1 in_stack_fffffffffffff75c;
  WirePointer WStack_8a0;
  WirePointer local_898;
  anon_union_4_5_35ddcec3_for_WirePointer_1 aStack_890;
  anon_union_4_5_35ddcec3_for_WirePointer_1 aStack_88c;
  uint local_888;
  StructPointerCount SStack_884;
  int iStack_880;
  undefined1 local_868 [32];
  WirePointer local_848;
  StructBuilder local_838;
  StructBuilder local_808;
  MemberInfo *local_7e0;
  ulong local_7d8;
  ulong local_7d0;
  Vector<capnp::compiler::BrandScope_*> local_7c8;
  undefined1 local_7a8 [8];
  WirePointer WStack_7a0;
  WirePointer local_798;
  anon_union_4_5_35ddcec3_for_WirePointer_1 aStack_790;
  BitsPerElementN<23> BStack_78c;
  StructDataBitCount local_788;
  StructPointerCount SStack_784;
  ElementSize EStack_782;
  undefined1 uStack_781;
  undefined1 local_778 [8];
  BrandScope *local_770;
  undefined1 local_768 [40];
  BrandedDecl *local_740;
  OrphanBuilder local_738;
  OrphanBuilder local_718;
  SegmentBuilder *local_6f8;
  WirePointer WStack_6f0;
  WirePointer local_6e8;
  undefined1 local_6d8 [4];
  uint uStack_6d4;
  undefined1 auStack_6d0 [64];
  StructOrGroup aSStack_690 [5];
  undefined1 local_668 [32];
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_capnp::compiler::NodeTranslator::StructTranslator::MemberInfo_*>,_std::_Select1st<std::pair<const_unsigned_int,_capnp::compiler::NodeTranslator::StructTranslator::MemberInfo_*>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_capnp::compiler::NodeTranslator::StructTranslator::MemberInfo_*>_>_>
  local_648;
  MemberInfo **ppMStack_618;
  RemoveConst<capnp::compiler::NodeTranslator::StructTranslator::MemberInfo_*> *local_610;
  MemberInfo **ppMStack_608;
  ArrayDisposer *local_600;
  String local_5f8;
  WirePointer local_5d8;
  ElementCount local_5cc;
  anon_union_4_5_35ddcec3_for_WirePointer_1 local_5c8;
  anon_union_4_5_35ddcec3_for_WirePointer_1 aStack_5c4;
  WireValue<uint32_t> WStack_5c0;
  anon_union_4_5_35ddcec3_for_WirePointer_1 aStack_5bc;
  anon_union_4_5_35ddcec3_for_WirePointer_1 local_5b8;
  anon_union_4_5_35ddcec3_for_WirePointer_1 aStack_5b4;
  uint32_t uStack_5b0;
  anon_union_4_5_35ddcec3_for_WirePointer_1 aStack_5ac;
  StructDataBitCount local_5a8;
  StructPointerCount SStack_5a4;
  ElementSize EStack_5a2;
  undefined1 uStack_5a1;
  int iStack_5a0;
  undefined4 uStack_59c;
  undefined1 local_598 [28];
  uint32_t uStack_57c;
  StructDataBitCount local_578;
  StructPointerCount SStack_574;
  ElementSize EStack_572;
  undefined1 uStack_571;
  int iStack_570;
  undefined4 uStack_56c;
  ListReader local_568;
  undefined1 local_538 [8];
  undefined8 uStack_530;
  anon_union_96_1_a8a2e026_for_OneOf<capnp::compiler::Resolver::ResolvedDecl,_capnp::compiler::Resolver::ResolvedParameter>_2
  local_528;
  CapTableReader *local_4c8;
  BrandScope *pBStack_4c0;
  undefined1 local_4b8 [200];
  WirePointer local_3f0 [5];
  undefined8 local_3c8 [5];
  anon_union_8_2_6a1c0e2c_for_MemberInfo_21 local_3a0;
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_capnp::compiler::NodeTranslator::StructTranslator::MemberInfo_*>,_std::_Select1st<std::pair<const_unsigned_int,_capnp::compiler::NodeTranslator::StructTranslator::MemberInfo_*>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_capnp::compiler::NodeTranslator::StructTranslator::MemberInfo_*>_>_>
  *local_398;
  WirePointer *local_390;
  undefined1 local_388 [8];
  WirePointer WStack_380;
  uint64_t *local_378;
  anon_union_48_1_a8c68091_for_NullableValue<capnp::compiler::LocatedInteger::Reader>_2 aStack_370;
  undefined1 local_338 [8];
  long *local_330;
  StructBuilder local_328;
  BrandedDecl *local_300;
  undefined8 *local_2f8;
  ArrayDisposer *local_2f0;
  MemberInfo ***local_2e8;
  undefined8 *local_2e0;
  undefined8 *local_2d8;
  undefined8 *local_2d0;
  WirePointer *local_2c8;
  undefined8 *local_2c0;
  size_t *local_2b8;
  _Base_ptr local_2b0;
  OrphanBuilder *local_2a8;
  _Rb_tree_node_base *local_2a0;
  undefined1 local_298 [8];
  _Rb_tree_node_base _Stack_290;
  size_t local_270;
  WirePointer local_268;
  WirePointer WStack_260;
  WirePointer local_258;
  WirePointer WStack_250;
  WirePointer local_248;
  StructReader local_238;
  PointerBuilder local_208;
  WirePointer local_1f0;
  undefined1 local_1e8 [12];
  anon_union_4_5_35ddcec3_for_WirePointer_1 aStack_1dc;
  WirePointer *local_1d0;
  StructPointerCount local_1c4;
  anon_union_4_5_35ddcec3_for_WirePointer_1 local_1c0;
  StructReader local_1b8;
  StructBuilder local_180;
  StructBuilder local_158;
  ListReader local_130;
  ListBuilder local_100;
  ListBuilder local_d8;
  ListBuilder local_b0;
  ListBuilder local_88;
  ListReader local_60;
  
  *(undefined2 *)((long)builder._builder.data + 0xc) = 3;
  local_390 = builder._builder.pointers + 3;
  local_538 = (undefined1  [8])builder._builder.segment;
  uStack_530._0_4_ = builder._builder.capTable._0_4_;
  aVar72.upper32Bits = uStack_530._0_4_;
  uStack_530._4_4_ = builder._builder.capTable._4_4_;
  aVar98.upper32Bits = uStack_530._4_4_;
  local_528._0_8_ = local_390;
  capnp::_::PointerBuilder::clear((PointerBuilder *)local_538);
  uVar95 = builder._builder.segment._0_2_;
  iVar97 = builder._builder.segment._2_6_;
  local_538 = (undefined1  [8])builder._builder.segment;
  uStack_530._0_4_ = aVar72.upper32Bits;
  uStack_530._4_4_ = aVar98.upper32Bits;
  local_528._0_8_ = builder._builder.pointers + 4;
  capnp::_::PointerBuilder::clear((PointerBuilder *)local_538);
  pWVar51 = decl._reader.pointers + 5;
  if (decl._reader.pointerCount < 6) {
    pWVar51 = (WirePointer *)0x0;
  }
  if (decl._reader.pointerCount < 6) {
    decl._reader.segment._0_4_ = 0;
    decl._reader.segment._4_4_ = 0;
    decl._reader.capTable._0_4_ = 0;
    decl._reader.capTable._4_4_ = 0;
    decl._reader.nestingLimit = 0x7fffffff;
  }
  local_538._4_4_ = decl._reader.segment._4_4_;
  local_538._0_4_ = decl._reader.segment._0_4_;
  local_528._0_4_ = SUB84(pWVar51,0);
  local_528._4_4_ = (undefined4)((ulong)pWVar51 >> 0x20);
  uStack_530._0_4_ = (anon_union_4_5_35ddcec3_for_WirePointer_1)(uint)decl._reader.capTable;
  uStack_530._4_4_ = (anon_union_4_5_35ddcec3_for_WirePointer_1)decl._reader.capTable._4_4_;
  local_528._8_4_ = decl._reader.nestingLimit;
  capnp::_::PointerReader::getList
            (&local_60,(PointerReader *)local_538,INLINE_COMPOSITE,(word *)0x0);
  local_538._2_6_ = iVar97;
  local_538._0_2_ = uVar95;
  this_00 = (PointerBuilder *)local_538;
  uStack_530._0_4_ = aVar72;
  uStack_530._4_4_ = aVar98;
  local_528._0_8_ = builder._builder.pointers + 4;
  capnp::_::PointerBuilder::initStructList
            (&local_88,this_00,local_60.elementCount,(StructSize)0x10001);
  local_7d8 = (ulong)local_60.elementCount;
  if (local_7d8 != 0) {
    ppCVar99 = &this_00[5].capTable;
    local_7e0 = (MemberInfo *)(local_668 + 0x10);
    uVar65 = 0;
    do {
      capnp::_::ListReader::getStructElement
                ((StructReader *)&stack0xfffffffffffff758,&local_60,(ElementCount)uVar65);
      aStack_370._8_4_ = 0;
      aStack_370._12_2_ = 0;
      aStack_370._14_2_ = 0;
      aStack_370._16_4_ = 0;
      aStack_370._20_2_ = 0;
      local_378 = (uint64_t *)0x0;
      aStack_370._0_6_ = 0;
      aStack_370._6_2_ = 0;
      local_388._0_4_ = 0;
      local_388._4_4_ = (anon_union_4_5_35ddcec3_for_WirePointer_1)0x0;
      WStack_380.offsetAndKind.value = 0;
      WStack_380.field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)0x0;
      aStack_370._22_1_ = 7;
      aStack_370._24_4_ = 0x7fffffff;
      implicitMethodParams.params.reader._44_4_ = aStack_370._28_4_;
      implicitMethodParams.params.reader.nestingLimit = 0x7fffffff;
      implicitMethodParams.params.reader._39_1_ = aStack_370._23_1_;
      implicitMethodParams.params.reader.structDataSize = 0;
      implicitMethodParams.params.reader.structPointerCount = 0;
      implicitMethodParams.params.reader.elementSize = INLINE_COMPOSITE;
      source._reader.segment._4_4_ = in_stack_fffffffffffff75c.upper32Bits;
      source._reader.segment._0_4_ = in_stack_fffffffffffff758.value;
      source._reader.capTable = (CapTableReader *)WStack_8a0;
      source._reader.data = (void *)local_898;
      source._reader.pointers = (WirePointer *)_aStack_890;
      source._reader._32_8_ = _local_888;
      source._reader._40_8_ = _iStack_880;
      auVar10 = ZEXT1640(ZEXT816(0));
      implicitMethodParams.scopeId = auVar10._0_8_;
      implicitMethodParams.params.reader.segment = (SegmentReader *)auVar10._8_8_;
      implicitMethodParams.params.reader.capTable = (CapTableReader *)auVar10._16_8_;
      implicitMethodParams.params.reader.ptr = (byte *)auVar10._24_8_;
      implicitMethodParams.params.reader.elementCount = auVar10._32_4_;
      implicitMethodParams.params.reader.step = auVar10._36_4_;
      BrandScope::compileDeclExpression
                ((Maybe<capnp::compiler::BrandedDecl> *)local_6d8,(this->localBrand).ptr,source,
                 this->resolver,implicitMethodParams);
      local_538[0] = local_6d8[0];
      bVar38 = local_6d8[0];
      if (local_6d8[0] == true) {
        uStack_530._0_4_ = auStack_6d0._0_4_;
        if (auStack_6d0._0_4_ == 2) {
          local_528._0_8_ = CONCAT44(auStack_6d0._12_4_,auStack_6d0._8_4_);
          local_528._8_4_ = auStack_6d0._16_4_;
          local_528._12_4_ = auStack_6d0._20_4_;
        }
        else if (auStack_6d0._0_4_ == 1) {
          local_528._32_4_ = auStack_6d0._40_4_;
          local_528._36_4_ = auStack_6d0._44_4_;
          local_528._16_4_ = auStack_6d0._24_4_;
          local_528._20_2_ = (undefined2)auStack_6d0._28_4_;
          local_528._22_2_ = SUB42(auStack_6d0._28_4_,2);
          local_528._24_4_ = auStack_6d0._32_4_;
          local_528._28_4_ = auStack_6d0._36_4_;
          local_528._8_4_ = auStack_6d0._16_4_;
          local_528._12_4_ = auStack_6d0._20_4_;
          local_528.space[0x28] = auStack_6d0[0x30];
          local_528._0_8_ = (WirePointer *)CONCAT44(auStack_6d0._12_4_,auStack_6d0._8_4_);
          if (auStack_6d0[0x30] == '\x01') {
            local_528._80_8_ = aSStack_690[3]._vptr_StructOrGroup;
            local_528._88_8_ = aSStack_690[4]._vptr_StructOrGroup;
            local_528._64_6_ = SUB86(aSStack_690[1]._vptr_StructOrGroup,0);
            local_528._70_2_ = (undefined2)((ulong)aSStack_690[1]._vptr_StructOrGroup >> 0x30);
            local_528._72_8_ = aSStack_690[2]._vptr_StructOrGroup;
            local_528._48_8_ = auStack_6d0._56_8_;
            local_528._56_6_ = SUB86(aSStack_690[0]._vptr_StructOrGroup,0);
            local_528._62_2_ = (undefined2)((ulong)aSStack_690[0]._vptr_StructOrGroup >> 0x30);
            auStack_6d0._48_8_ = auStack_6d0._48_8_ & 0xffffffffffffff00;
            local_528._0_8_ = (WirePointer *)CONCAT44(auStack_6d0._12_4_,auStack_6d0._8_4_);
          }
        }
        local_4c8 = (CapTableReader *)local_668._0_8_;
        pBStack_4c0 = (BrandScope *)local_668._8_8_;
        pAVar7 = ((SegmentReader *)&local_7e0->parent)->arena;
        p_Var55 = *(_Base_ptr *)&local_7e0->codeOrder;
        p_Var62 = (_Base_ptr)((ArrayPtr<const_capnp::word> *)&local_7e0->childCount)->ptr;
        p_Var100 = *(_Base_ptr *)&local_7e0->unionDiscriminantCount;
        sVar73 = (local_7e0->name).content.size_;
        ppCVar99[4] = (CapTableBuilder *)(local_7e0->name).content.ptr;
        ppCVar99[5] = (CapTableBuilder *)sVar73;
        ppCVar99[2] = (CapTableBuilder *)p_Var62;
        ppCVar99[3] = (CapTableBuilder *)p_Var100;
        *ppCVar99 = (CapTableBuilder *)pAVar7;
        ppCVar99[1] = (CapTableBuilder *)p_Var55;
        BrandedDecl::getKind((BrandedDecl *)&uStack_530);
        if (local_6d8[0] == true) {
          if (local_6d8._2_2_ == 9) {
            capnp::_::ListBuilder::getStructElement
                      ((StructBuilder *)&local_1b8,&local_88,(ElementCount)uVar65);
            pBVar69 = pBStack_4c0;
            local_388[0] = uStack_530._0_4_ == 1;
            if (uStack_530._0_4_ != 1) {
              kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&>
                        ((Fault *)local_6d8,
                         "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compiler/generics.h"
                         ,0x115,FAILED,"body.is<Resolver::ResolvedDecl>()","_kjCondition,",
                         (DebugExpression<bool> *)local_388);
              kj::_::Debug::Fault::fatal((Fault *)local_6d8);
            }
            local_598._0_8_ = (SegmentReader *)0x0;
            local_598._8_8_ = (SegmentReader *)0x0;
            local_598._16_8_ = (SegmentReader *)0x0;
            stack0xfffffffffffffa80 = (ArrayDisposer *)&kj::NullArrayDisposer::instance;
            pSVar41 = (SegmentReader *)0x0;
            pBVar70 = pBStack_4c0;
            do {
              if (((pBVar70->params).size_ != 0) ||
                 ((pBVar70->inherited == true && (pBVar70->leafParamCount != 0)))) {
                if (pSVar41 == (SegmentReader *)local_598._16_8_) {
                  sVar73 = (long)pSVar41 - local_598._0_8_ >> 2;
                  if (pSVar41 == (SegmentReader *)local_598._0_8_) {
                    sVar73 = 4;
                  }
                  kj::Vector<capnp::compiler::BrandScope_*>::setCapacity
                            ((Vector<capnp::compiler::BrandScope_*> *)local_598,sVar73);
                  pSVar41 = (SegmentReader *)local_598._8_8_;
                }
                pSVar41->arena = (Arena *)pBVar70;
                pSVar41 = (SegmentReader *)(local_598._8_8_ + 8);
                local_598._8_8_ = pSVar41;
              }
              pBVar70 = (pBVar70->parent).ptr.ptr;
            } while (pBVar70 != (BrandScope *)0x0);
            if (pSVar41 != (SegmentReader *)local_598._0_8_) {
              local_568.segment = local_1b8.segment;
              local_568.capTable = local_1b8.capTable;
              local_568.ptr = (byte *)local_1b8.pointers;
              uVar86 = uVar65;
              capnp::_::PointerBuilder::initStruct
                        ((StructBuilder *)local_388,(PointerBuilder *)&local_568,(StructSize)0x10000
                        );
              local_568.ptr = (byte *)CONCAT26(aStack_370._6_2_,aStack_370._0_6_);
              local_568.segment = (SegmentReader *)local_388;
              local_568.capTable = (CapTableReader *)WStack_380;
              capnp::_::PointerBuilder::initStructList
                        ((ListBuilder *)local_6d8,(PointerBuilder *)&local_568,
                         (ElementCount)((ulong)(local_598._8_8_ - local_598._0_8_) >> 3),
                         (StructSize)0x10002);
              if (local_598._8_8_ - local_598._0_8_ != 0) {
                local_7d0 = (long)(local_598._8_8_ - local_598._0_8_) >> 3;
                uVar82 = 0;
                do {
                  capnp::_::ListBuilder::getStructElement
                            ((StructBuilder *)local_388,(ListBuilder *)local_6d8,
                             (ElementCount)uVar82);
                  uVar88 = uVar82 & 0xffffffff;
                  pBVar70 = (BrandScope *)((Arena **)local_598._0_8_)[uVar88];
                  *local_378 = pBVar70->leafId;
                  if (pBVar70->inherited == true) {
                    *(undefined2 *)(local_378 + 1) = 1;
                  }
                  else {
                    sVar73 = (pBVar70->params).size_;
                    *(undefined2 *)(local_378 + 1) = 0;
                    _Stack_290._M_parent = (_Base_ptr)CONCAT26(aStack_370._6_2_,aStack_370._0_6_);
                    local_298 = local_388;
                    _Stack_290._M_color = WStack_380.offsetAndKind.value;
                    _Stack_290._4_4_ = WStack_380.field_1;
                    uVar65 = uVar86;
                    capnp::_::PointerBuilder::initStructList
                              ((ListBuilder *)&local_568,(PointerBuilder *)local_298,
                               (ElementCount)sVar73,(StructSize)0x10001);
                    uVar85 = (ulong)local_568.elementCount;
                    uVar86 = uVar65;
                    if (uVar85 != 0) {
                      lVar42 = 0;
                      uVar81 = 0;
                      do {
                        pBVar4 = (((BrandScope *)((Arena **)local_598._0_8_)[uVar88])->params).ptr;
                        pEVar68 = pBVar69->errorReporter;
                        capnp::_::ListBuilder::getStructElement
                                  ((StructBuilder *)local_298,(ListBuilder *)&local_568,
                                   (ElementCount)uVar81);
                        *(undefined2 *)
                         &((WireValue<uint32_t> *)&(_Stack_290._M_parent)->_M_color)->value = 1;
                        local_238.segment = (SegmentReader *)local_298;
                        local_238.capTable = (CapTableReader *)_Stack_290._0_8_;
                        local_238.data = _Stack_290._M_left;
                        capnp::_::PointerBuilder::initStruct
                                  ((StructBuilder *)&local_5c8.structRef,
                                   (PointerBuilder *)&local_238,(StructSize)0x10003);
                        target._builder.pointerCount = SStack_5a4;
                        target._builder._38_1_ = EStack_5a2;
                        target._builder._39_1_ = uStack_5a1;
                        target._builder.dataSize = local_5a8;
                        target._builder.segment._4_4_ = aStack_5c4.upper32Bits;
                        target._builder.segment._0_4_ = local_5c8.upper32Bits;
                        target._builder.capTable._4_4_ = aStack_5bc.upper32Bits;
                        target._builder.capTable._0_4_ = WStack_5c0.value;
                        target._builder.data._4_4_ = aStack_5b4.upper32Bits;
                        target._builder.data._0_4_ = local_5b8.upper32Bits;
                        target._builder.pointers._4_4_ = aStack_5ac.upper32Bits;
                        target._builder.pointers._0_4_ = uStack_5b0;
                        BrandedDecl::compileAsType
                                  ((BrandedDecl *)((long)&(pBVar4->body).tag + lVar42),pEVar68,
                                   target);
                        uVar81 = uVar81 + 1;
                        lVar42 = lVar42 + 0xa8;
                        uVar86 = uVar65;
                      } while (uVar85 != uVar81);
                    }
                  }
                  uVar82 = uVar82 + 1;
                } while (uVar82 != local_7d0);
              }
            }
            uVar94 = local_598._16_8_;
            uVar93 = local_598._8_8_;
            uVar78 = local_598._0_8_;
            if ((SegmentReader *)local_598._0_8_ != (SegmentReader *)0x0) {
              local_598._0_8_ = (SegmentReader *)0x0;
              local_598._8_8_ = (SegmentReader *)0x0;
              local_598._16_8_ = (SegmentReader *)0x0;
              in_R8 = (WirePointer)((long)(uVar94 - uVar78) >> 3);
              (*(code *)**(undefined8 **)stack0xfffffffffffffa80)
                        (stack0xfffffffffffffa80,uVar78,8,(long)(uVar93 - uVar78) >> 3);
            }
            *(undefined8 *)local_1b8.data = local_528._0_8_;
          }
          else {
            pEVar68 = this->errorReporter;
            BrandedDecl::toString((String *)local_388,(BrandedDecl *)&uStack_530);
            kj::str<char_const(&)[2],kj::String,char_const(&)[23]>
                      ((String *)local_6d8,(kj *)0x1c0ea5,(char (*) [2])local_388,
                       (String *)"\' is not an interface.",(char (*) [23])in_R8);
            in_R8 = (WirePointer)
                    (CONCAT44(auStack_6d0._4_4_,auStack_6d0._0_4_) +
                    (ulong)(CONCAT44(auStack_6d0._4_4_,auStack_6d0._0_4_) == 0));
            uVar86 = 0;
            if ((uint)local_4b8._32_4_ < 0x40) {
              uVar82 = 0;
            }
            else {
              uVar82 = (ulong)*(uint *)(CONCAT44(local_4b8._20_4_,local_4b8._16_4_) + 4);
              if (0x9f < (uint)local_4b8._32_4_) {
                uVar86 = (ulong)*(uint *)(CONCAT44(local_4b8._20_4_,local_4b8._16_4_) + 0x10);
              }
            }
            (**pEVar68->_vptr_ErrorReporter)(pEVar68,uVar82,uVar86);
            lVar42 = CONCAT44(uStack_6d4,
                              CONCAT22(local_6d8._2_2_,CONCAT11(local_6d8[1],local_6d8[0])));
            if (lVar42 != 0) {
              in_R8.field_1.upper32Bits = auStack_6d0._4_4_;
              in_R8.offsetAndKind.value = auStack_6d0._0_4_;
              local_6d8[0] = false;
              local_6d8[1] = 0;
              local_6d8._2_2_ = 0;
              uStack_6d4 = 0;
              auStack_6d0._0_4_ = 0;
              auStack_6d0._4_4_ = 0;
              (*(code *)**(undefined8 **)CONCAT44(auStack_6d0._12_4_,auStack_6d0._8_4_))
                        ((undefined8 *)CONCAT44(auStack_6d0._12_4_,auStack_6d0._8_4_),lVar42,1);
            }
            WVar77 = WStack_380;
            auVar18 = local_388;
            if ((WirePointer)local_388 != (WirePointer)0x0) {
              local_388._0_4_ = 0;
              local_388._4_4_ = (anon_union_4_5_35ddcec3_for_WirePointer_1)0x0;
              WStack_380.offsetAndKind.value = 0;
              WStack_380.field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)0x0;
              (**(code **)*local_378)(local_378,auVar18,1);
              in_R8 = WVar77;
            }
          }
        }
        else {
          pEVar68 = this->errorReporter;
          BrandedDecl::toString((String *)local_388,(BrandedDecl *)&uStack_530);
          kj::str<char_const(&)[2],kj::String,char_const(&)[79]>
                    ((String *)local_6d8,(kj *)0x1c0ea5,(char (*) [2])local_388,
                     (String *)
                     "\' is an unbound generic parameter. Currently we don\'t support extending these."
                     ,(char (*) [79])in_R8);
          in_R8 = (WirePointer)
                  (CONCAT44(auStack_6d0._4_4_,auStack_6d0._0_4_) +
                  (ulong)(CONCAT44(auStack_6d0._4_4_,auStack_6d0._0_4_) == 0));
          uVar86 = 0;
          if ((uint)local_4b8._32_4_ < 0x40) {
            uVar82 = 0;
          }
          else {
            uVar82 = (ulong)*(uint *)(CONCAT44(local_4b8._20_4_,local_4b8._16_4_) + 4);
            if (0x9f < (uint)local_4b8._32_4_) {
              uVar86 = (ulong)*(uint *)(CONCAT44(local_4b8._20_4_,local_4b8._16_4_) + 0x10);
            }
          }
          (**pEVar68->_vptr_ErrorReporter)(pEVar68,uVar82,uVar86);
          lVar42 = CONCAT44(uStack_6d4,CONCAT22(local_6d8._2_2_,CONCAT11(local_6d8[1],local_6d8[0]))
                           );
          if (lVar42 != 0) {
            in_R8.field_1.upper32Bits = auStack_6d0._4_4_;
            in_R8.offsetAndKind.value = auStack_6d0._0_4_;
            local_6d8[0] = false;
            local_6d8[1] = 0;
            local_6d8._2_2_ = 0;
            uStack_6d4 = 0;
            auStack_6d0._0_4_ = 0;
            auStack_6d0._4_4_ = 0;
            (*(code *)**(undefined8 **)CONCAT44(auStack_6d0._12_4_,auStack_6d0._8_4_))
                      ((undefined8 *)CONCAT44(auStack_6d0._12_4_,auStack_6d0._8_4_),lVar42,1,in_R8,
                       in_R8,0);
          }
          WVar77 = WStack_380;
          auVar18 = local_388;
          if ((WirePointer)local_388 != (WirePointer)0x0) {
            local_388._0_4_ = 0;
            local_388._4_4_ = (anon_union_4_5_35ddcec3_for_WirePointer_1)0x0;
            WStack_380.offsetAndKind.value = 0;
            WStack_380.field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)0x0;
            (**(code **)*local_378)(local_378,auVar18,1);
            in_R8 = WVar77;
          }
        }
        bVar38 = local_538[0];
      }
      pBVar69 = pBStack_4c0;
      if (((bVar38 & 1) != 0) && (pBStack_4c0 != (BrandScope *)0x0)) {
        pBStack_4c0 = (BrandScope *)0x0;
        (**local_4c8->_vptr_CapTableReader)
                  (local_4c8,
                   (pBVar69->super_Refcounted).super_Disposer._vptr_Disposer[-2] +
                   (long)&(pBVar69->super_Refcounted).super_Disposer._vptr_Disposer);
      }
      uVar65 = uVar65 + 1;
    } while (uVar65 != local_7d8);
  }
  LVar13 = members.reader.elementCount;
  _Stack_290._M_left = &_Stack_290;
  _Stack_290._0_8_ = _Stack_290._0_8_ & 0xffffffff00000000;
  local_270._0_4_ = 0;
  _Stack_290._M_parent = (_Base_ptr)0x0;
  local_270 = 0;
  _Stack_290._M_right = _Stack_290._M_left;
  if (members.reader.elementCount != 0) {
    aVar79.upper32Bits = 0;
    EVar87 = 0;
    do {
      capnp::_::ListReader::getStructElement((StructReader *)local_388,&members.reader,EVar87);
      if ((0x1f < (uint)aStack_370._8_4_) && (*(short *)((long)local_378 + 2) == 10)) {
        lVar42 = CONCAT26(aStack_370._6_2_,aStack_370._0_6_) + 8;
        if ((ushort)aStack_370._12_2_ < 2) {
          lVar42 = 0;
          uVar91 = 0;
          uStack_6d4 = 0;
          auStack_6d0._0_4_ = 0;
          auStack_6d0._4_4_ = 0;
          auStack_6d0._16_4_ = 0x7fffffff;
        }
        else {
          uVar91 = local_388._0_4_;
          uStack_6d4 = local_388._4_4_;
          auStack_6d0._0_4_ = WStack_380.offsetAndKind.value;
          auStack_6d0._4_4_ = WStack_380.field_1.upper32Bits;
          auStack_6d0._16_4_ = aStack_370._16_4_;
        }
        local_6d8[0] = SUB41(uVar91,0);
        local_6d8[1] = (undefined1)(uVar91 >> 8);
        local_6d8._2_2_ = (undefined2)(uVar91 >> 0x10);
        auStack_6d0._8_4_ = (undefined4)lVar42;
        auStack_6d0._12_4_ = (undefined4)((ulong)lVar42 >> 0x20);
        capnp::_::PointerReader::getStruct
                  ((StructReader *)&stack0xfffffffffffff758,(PointerReader *)local_6d8,(word *)0x0);
        if (local_888 < 0x40) {
          local_538._0_4_ = 0;
          local_538._4_4_ = (anon_union_4_5_35ddcec3_for_WirePointer_1)0x0;
        }
        else {
          local_538 = *(undefined1 (*) [8])local_898;
        }
        auStack_6d0._28_4_ = aStack_370._8_4_;
        auStack_6d0._32_4_ =
             (undefined4)
             (CONCAT26(aStack_370._14_2_,CONCAT24(aStack_370._12_2_,aStack_370._8_4_)) >> 0x20);
        auStack_6d0._36_4_ = aStack_370._16_4_;
        auStack_6d0._40_4_ =
             (undefined4)
             (CONCAT17(aStack_370._23_1_,
                       CONCAT16(aStack_370._22_1_,CONCAT24(aStack_370._20_2_,aStack_370._16_4_))) >>
             0x20);
        auStack_6d0._12_4_ = SUB84(local_378,0);
        auStack_6d0._16_4_ = (undefined4)((ulong)local_378 >> 0x20);
        auStack_6d0._20_4_ = (undefined4)aStack_370._0_6_;
        auStack_6d0._24_4_ = (undefined4)(CONCAT26(aStack_370._6_2_,aStack_370._0_6_) >> 0x20);
        uStack_6d4 = local_388._0_4_;
        auStack_6d0._0_4_ = local_388._4_4_;
        auStack_6d0._4_4_ = WStack_380.offsetAndKind.value;
        auStack_6d0._8_4_ = WStack_380.field_1;
        local_528._44_4_ = auStack_6d0._40_4_;
        uStack_530._5_1_ = local_6d8[1];
        uStack_530._4_1_ = local_6d8[0];
        uStack_530._6_2_ = local_6d8._2_2_;
        local_528._28_4_ = auStack_6d0._24_4_;
        local_528._32_4_ = aStack_370._8_4_;
        local_528._36_4_ = auStack_6d0._32_4_;
        local_528._40_4_ = aStack_370._16_4_;
        local_528._12_4_ = auStack_6d0._8_4_;
        local_528._16_4_ = auStack_6d0._12_4_;
        local_528._20_2_ = (undefined2)((ulong)local_378 >> 0x20);
        local_528._22_2_ = (undefined2)((ulong)local_378 >> 0x30);
        local_528._24_4_ = auStack_6d0._20_4_;
        local_528._0_4_ = uStack_6d4;
        local_528._4_4_ = auStack_6d0._0_4_;
        local_528._8_4_ = auStack_6d0._4_4_;
        uStack_530._0_4_ = aVar79;
        std::
        _Rb_tree<unsigned_int,std::pair<unsigned_int_const,std::pair<unsigned_int,capnp::compiler::Declaration::Reader>>,std::_Select1st<std::pair<unsigned_int_const,std::pair<unsigned_int,capnp::compiler::Declaration::Reader>>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::pair<unsigned_int,capnp::compiler::Declaration::Reader>>>>
        ::
        _M_emplace_equal<std::pair<unsigned_long,std::pair<unsigned_int,capnp::compiler::Declaration::Reader>>>
                  ((_Rb_tree<unsigned_int,std::pair<unsigned_int_const,std::pair<unsigned_int,capnp::compiler::Declaration::Reader>>,std::_Select1st<std::pair<unsigned_int_const,std::pair<unsigned_int,capnp::compiler::Declaration::Reader>>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::pair<unsigned_int,capnp::compiler::Declaration::Reader>>>>
                    *)local_298,
                   (pair<unsigned_long,_std::pair<unsigned_int,_capnp::compiler::Declaration::Reader>_>
                    *)local_538);
        aVar79.upper32Bits = aVar79.upper32Bits + 1;
      }
      EVar87 = EVar87 + 1;
    } while (LVar13 != EVar87);
  }
  local_538 = (undefined1  [8])CONCAT62(iVar97,uVar95);
  local_528._0_4_ = SUB84(local_390,0);
  local_528._4_4_ = (undefined4)((ulong)local_390 >> 0x20);
  uStack_530._0_4_ = aVar72;
  uStack_530._4_4_ = aVar98;
  capnp::_::PointerBuilder::initStructList
            (&local_b0,(PointerBuilder *)local_538,(ElementCount)local_270,(StructSize)0x50003);
  capnp::_::OrphanBuilder::asStruct
            ((StructBuilder *)local_538,&(this->sourceInfo).builder,(StructSize)0x20002);
  auStack_6d0._8_8_ = CONCAT44(local_528._12_4_,local_528._8_4_) + 8;
  local_6d8[0] = local_538[0];
  local_6d8[1] = local_538[1];
  local_6d8._2_2_ = local_538._2_2_;
  uStack_6d4 = local_538._4_4_;
  auStack_6d0._0_4_ = uStack_530._0_4_;
  auStack_6d0._4_4_ = uStack_530._4_4_;
  capnp::_::PointerBuilder::initStructList
            (&local_d8,(PointerBuilder *)local_6d8,(ElementCount)local_270,(StructSize)0x10001);
  local_388 = (undefined1  [8])this->errorReporter;
  WStack_380 = (WirePointer)((ulong)WStack_380 & 0xffffffff00000000);
  local_378 = (uint64_t *)((ulong)local_378 & 0xffffffffffffff00);
  if (_Stack_290._M_left != &_Stack_290) {
    local_300 = (BrandedDecl *)local_4b8;
    local_2f8 = (undefined8 *)(local_668 + 0x10);
    local_2a8 = &(this->wipNode).builder;
    local_2b0 = &local_648._M_impl.super__Rb_tree_header._M_header;
    local_2b8 = &local_648._M_impl.super__Rb_tree_header._M_node_count;
    local_2c0 = local_3c8;
    local_2c8 = local_3f0;
    local_2d0 = (undefined8 *)(local_4b8 + 0x18);
    local_2d8 = (undefined8 *)(local_4b8 + 0x48);
    local_2f0 = (ArrayDisposer *)&this->paramStructs;
    local_2e0 = (undefined8 *)(local_4b8 + 0x78);
    local_2e8 = &ppMStack_618;
    local_398 = &local_648;
    EVar87 = 0;
    p_Var55 = _Stack_290._M_left;
    do {
      local_7e0 = (MemberInfo *)p_Var55[1]._M_left;
      p_Var62 = p_Var55[1]._M_right;
      p_Var100 = p_Var55[2]._M_parent;
      uVar2 = *(ushort *)((long)&p_Var55[2]._M_left + 4);
      local_528._8_4_ = *(undefined4 *)&p_Var55[2]._M_right;
      local_7d0 = CONCAT62(local_7d0._2_6_,uVar2);
      local_7d8 = CONCAT44(local_7d8._4_4_,local_528._8_4_);
      if (uVar2 < 2) {
        p_Var59 = (_Base_ptr)0x0;
        pp_Var43 = (_Base_ptr *)0x0;
        local_538 = (undefined1  [8])0x0;
        local_528._8_4_ = 0x7fffffff;
      }
      else {
        pp_Var43 = &p_Var100->_M_parent;
        p_Var59 = p_Var62;
        local_538 = (undefined1  [8])local_7e0;
      }
      uVar71 = *(undefined4 *)&p_Var55[1]._M_parent;
      local_740 = *(BrandedDecl **)(p_Var55 + 2);
      uVar91 = *(uint *)&p_Var55[2]._M_left;
      uStack_530._0_4_ = SUB84(p_Var59,0);
      uStack_530._4_4_ = SUB84((ulong)p_Var59 >> 0x20,0);
      local_528._0_4_ = SUB84(pp_Var43,0);
      local_528._4_4_ = (undefined4)((ulong)pp_Var43 >> 0x20);
      capnp::_::PointerReader::getStruct(&local_1b8,(PointerReader *)local_538,(word *)0x0);
      ordinal._reader.pointerCount = local_1b8.pointerCount;
      ordinal._reader._38_2_ = local_1b8._38_2_;
      ordinal._reader.dataSize = local_1b8.dataSize;
      ordinal._reader.capTable = local_1b8.capTable;
      ordinal._reader.segment = local_1b8.segment;
      ordinal._reader.data = local_1b8.data;
      ordinal._reader.pointers = local_1b8.pointers;
      ordinal._reader.nestingLimit = local_1b8.nestingLimit;
      ordinal._reader._44_4_ = local_1b8._44_4_;
      DuplicateOrdinalDetector::check((DuplicateOrdinalDetector *)local_388,ordinal);
      if (local_1b8.dataSize < 0x40) {
        uVar2 = 0;
      }
      else {
        uVar2 = *local_1b8.data;
      }
      capnp::_::ListBuilder::getStructElement(&local_158,&local_d8,EVar87);
      if ((ushort)local_7d0 < 5) {
        local_538 = (undefined1  [8])0x0;
        uStack_530._0_4_ = (anon_union_4_5_35ddcec3_for_WirePointer_1)0x0;
        uStack_530._4_4_ = (anon_union_4_5_35ddcec3_for_WirePointer_1)0x0;
        local_528._0_8_ = (_Base_ptr)0x0;
        local_528._8_4_ = 0x7fffffff;
      }
      else {
        local_528._0_8_ = p_Var100 + 1;
        local_538 = (undefined1  [8])local_7e0;
        uStack_530._0_4_ = SUB84(p_Var62,0);
        uStack_530._4_4_ = SUB84((ulong)p_Var62 >> 0x20,0);
        local_528._8_4_ = local_7d8._0_4_;
      }
      PVar39 = capnp::_::PointerReader::getPointerType((PointerReader *)local_538);
      if (PVar39 != NULL_) {
        if ((ushort)local_7d0 < 5) {
          local_528._8_4_ = 0x7fffffff;
          p_Var59 = (_Base_ptr)0x0;
          p_Var44 = (_Base_ptr)0x0;
          local_538 = (undefined1  [8])0x0;
        }
        else {
          p_Var44 = p_Var100 + 1;
          p_Var59 = p_Var62;
          local_538 = (undefined1  [8])local_7e0;
          local_528._8_4_ = local_7d8._0_4_;
        }
        uStack_530._0_4_ = SUB84(p_Var59,0);
        uStack_530._4_4_ = SUB84((ulong)p_Var59 >> 0x20,0);
        local_528._0_4_ = SUB84(p_Var44,0);
        local_528._4_4_ = (undefined4)((ulong)p_Var44 >> 0x20);
        RVar92 = capnp::_::PointerReader::getBlob<capnp::Text>
                           ((PointerReader *)local_538,(void *)0x0,0);
        local_538 = (undefined1  [8])local_158.segment;
        uStack_530._0_4_ = SUB84(local_158.capTable,0);
        uStack_530._4_4_ = SUB84((ulong)local_158.capTable >> 0x20,0);
        local_528._0_4_ = SUB84(local_158.pointers,0);
        local_528._4_4_ = (undefined4)((ulong)local_158.pointers >> 0x20);
        capnp::_::PointerBuilder::setBlob<capnp::Text>((PointerBuilder *)local_538,RVar92);
      }
      if (uVar91 < 0x40) {
        *(undefined4 *)local_158.data = 0;
        uVar56 = 0;
      }
      else {
        *(undefined4 *)local_158.data = *(undefined4 *)&(local_740->body).field_0x4;
        uVar56 = 0;
        if (0x5f < uVar91) {
          uVar56 = *(undefined4 *)&(local_740->body).field_1;
        }
      }
      *(undefined4 *)((long)local_158.data + 4) = uVar56;
      capnp::_::ListBuilder::getStructElement(&local_328,&local_b0,EVar87);
      if ((ushort)local_7d0 == 0) {
        auStack_6d0._16_4_ = 0x7fffffff;
        p_Var59 = (_Base_ptr)0x0;
        p_Var44 = (_Base_ptr)0x0;
        pMVar74 = (MemberInfo *)0x0;
      }
      else {
        p_Var59 = p_Var62;
        p_Var44 = p_Var100;
        pMVar74 = local_7e0;
        auStack_6d0._16_4_ = local_7d8._0_4_;
      }
      local_6d8[0] = SUB81(pMVar74,0);
      local_6d8[1] = (undefined1)((ulong)pMVar74 >> 8);
      local_6d8._2_2_ = (undefined2)((ulong)pMVar74 >> 0x10);
      uStack_6d4 = (uint)((ulong)pMVar74 >> 0x20);
      auStack_6d0._0_4_ = SUB84(p_Var59,0);
      auStack_6d0._4_4_ = (undefined4)((ulong)p_Var59 >> 0x20);
      auStack_6d0._8_4_ = SUB84(p_Var44,0);
      auStack_6d0._12_4_ = (undefined4)((ulong)p_Var44 >> 0x20);
      capnp::_::PointerReader::getStruct
                ((StructReader *)local_538,(PointerReader *)local_6d8,(word *)0x0);
      auStack_6d0._16_4_ = local_528._24_4_;
      auStack_6d0._12_4_ = local_528._12_4_;
      auStack_6d0._8_4_ = local_528._8_4_;
      if (local_528._20_2_ == 0) {
        auStack_6d0._16_4_ = 0x7fffffff;
        auStack_6d0._12_4_ = 0;
        auStack_6d0._8_4_ = 0;
      }
      uVar56 = 0;
      uStack_6d4 = 0;
      auStack_6d0._0_4_ = 0;
      auStack_6d0._4_4_ = 0;
      if (local_528._20_2_ != 0) {
        uVar56 = local_538._0_4_;
        uStack_6d4 = local_538._4_4_;
        auStack_6d0._0_4_ = uStack_530._0_4_;
        auStack_6d0._4_4_ = uStack_530._4_4_;
      }
      local_6d8[0] = SUB41(uVar56,0);
      local_6d8[1] = (undefined1)((uint)uVar56 >> 8);
      local_6d8._2_2_ = (undefined2)((uint)uVar56 >> 0x10);
      RVar92 = capnp::_::PointerReader::getBlob<capnp::Text>
                         ((PointerReader *)local_6d8,(void *)0x0,0);
      local_6d8[0] = SUB81(local_328.segment,0);
      local_6d8[1] = (undefined1)((ulong)local_328.segment >> 8);
      local_6d8._2_2_ = (undefined2)((ulong)local_328.segment >> 0x10);
      uStack_6d4 = (uint)((ulong)local_328.segment >> 0x20);
      auStack_6d0._0_4_ = SUB84(local_328.capTable,0);
      auStack_6d0._4_4_ = (undefined4)((ulong)local_328.capTable >> 0x20);
      auStack_6d0._8_4_ = SUB84(local_328.pointers,0);
      auStack_6d0._12_4_ = (undefined4)((ulong)local_328.pointers >> 0x20);
      capnp::_::PointerBuilder::setBlob<capnp::Text>((PointerBuilder *)local_6d8,RVar92);
      *(short *)&(((Refcounted *)local_328.data)->super_Disposer)._vptr_Disposer = (short)uVar71;
      if ((ushort)local_7d0 < 8) {
        local_528._8_4_ = 0x7fffffff;
        p_Var59 = (_Base_ptr)0x0;
        pp_Var43 = (_Base_ptr *)0x0;
        local_538 = (undefined1  [8])0x0;
      }
      else {
        pp_Var43 = &p_Var100[1]._M_right;
        p_Var59 = p_Var62;
        local_538 = (undefined1  [8])local_7e0;
        local_528._8_4_ = local_7d8._0_4_;
      }
      uStack_530._0_4_ = SUB84(p_Var59,0);
      uStack_530._4_4_ = SUB84((ulong)p_Var59 >> 0x20,0);
      local_528._0_4_ = SUB84(pp_Var43,0);
      local_528._4_4_ = (undefined4)((ulong)pp_Var43 >> 0x20);
      local_5cc = EVar87;
      local_2a0 = p_Var55;
      capnp::_::PointerReader::getList
                ((ListReader *)local_598,(PointerReader *)local_538,INLINE_COMPOSITE,(word *)0x0);
      local_528._0_8_ = local_328.pointers + 4;
      local_538 = (undefined1  [8])local_328.segment;
      uStack_530._0_4_ = SUB84(local_328.capTable,0);
      uStack_530._4_4_ = SUB84((ulong)local_328.capTable >> 0x20,0);
      capnp::_::PointerBuilder::initStructList
                (&local_100,(PointerBuilder *)local_538,local_598._24_4_,(StructSize)0x10000);
      uVar65 = (ulong)stack0xfffffffffffffa80 & 0xffffffff;
      if (uVar65 != 0) {
        uVar86 = 0;
        do {
          capnp::_::ListBuilder::getStructElement
                    ((StructBuilder *)local_6d8,&local_100,(ElementCount)uVar86);
          capnp::_::ListReader::getStructElement
                    ((StructReader *)local_538,(ListReader *)local_598,(ElementCount)uVar86);
          uVar71 = local_528._24_4_;
          if (local_528._20_2_ == 0) {
            uVar71 = 0x7fffffff;
          }
          aStack_890 = (anon_union_4_5_35ddcec3_for_WirePointer_1)
                       (anon_union_4_5_35ddcec3_for_WirePointer_1)uVar71;
          RVar92 = capnp::_::PointerReader::getBlob<capnp::Text>
                             ((PointerReader *)&stack0xfffffffffffff758,(void *)0x0,0);
          local_898.field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)auStack_6d0._20_4_;
          local_898.offsetAndKind.value = auStack_6d0._16_4_;
          in_stack_fffffffffffff758.value =
               CONCAT22(local_6d8._2_2_,CONCAT11(local_6d8[1],local_6d8[0]));
          WStack_8a0.field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)auStack_6d0._4_4_;
          WStack_8a0.offsetAndKind.value = auStack_6d0._0_4_;
          in_stack_fffffffffffff75c = (anon_union_4_5_35ddcec3_for_WirePointer_1)uStack_6d4;
          capnp::_::PointerBuilder::setBlob<capnp::Text>
                    ((PointerBuilder *)&stack0xfffffffffffff758,RVar92);
          uVar86 = uVar86 + 1;
        } while (uVar65 != uVar86);
      }
      if ((ushort)local_7d0 < 6) {
        local_528._8_4_ = 0x7fffffff;
        p_Var55 = (_Base_ptr)0x0;
        pp_Var43 = (_Base_ptr *)0x0;
        local_538 = (undefined1  [8])0x0;
      }
      else {
        pp_Var43 = &p_Var100[1]._M_parent;
        p_Var55 = p_Var62;
        local_538 = (undefined1  [8])local_7e0;
        local_528._8_4_ = local_7d8._0_4_;
      }
      uStack_530._0_4_ = SUB84(p_Var55,0);
      uStack_530._4_4_ = SUB84((ulong)p_Var55 >> 0x20,0);
      local_528._0_4_ = SUB84(pp_Var43,0);
      local_528._4_4_ = (undefined4)((ulong)pp_Var43 >> 0x20);
      capnp::_::PointerReader::getStruct(&local_238,(PointerReader *)local_538,(word *)0x0);
      if ((0xf < local_238.dataSize) && ((short)((WireValue<uint32_t> *)local_238.data)->value == 2)
         ) {
        uVar65 = 0;
        if (local_238.dataSize < 0x40) {
          uVar86 = 0;
        }
        else {
          uVar86 = (ulong)((anon_union_4_5_35ddcec3_for_WirePointer_1 *)((long)local_238.data + 4))
                          ->upper32Bits;
          if (0x5f < local_238.dataSize) {
            uVar65 = (ulong)*(uint *)((long)local_238.data + 8);
          }
        }
        (**this->errorReporter->_vptr_ErrorReporter)
                  (this->errorReporter,uVar86,uVar65,
                   "\'stream\' can only appear after \'->\', not before.",0x31);
      }
      if ((ushort)local_7d0 == 0) {
        local_528._8_4_ = 0x7fffffff;
        p_Var55 = (_Base_ptr)0x0;
        p_Var59 = (_Base_ptr)0x0;
        local_538 = (undefined1  [8])0x0;
      }
      else {
        p_Var55 = p_Var62;
        p_Var59 = p_Var100;
        local_538 = (undefined1  [8])local_7e0;
        local_528._8_4_ = local_7d8._0_4_;
      }
      uStack_530._0_4_ = SUB84(p_Var55,0);
      uStack_530._4_4_ = SUB84((ulong)p_Var55 >> 0x20,0);
      local_528._0_4_ = SUB84(p_Var59,0);
      local_528._4_4_ = (undefined4)((ulong)p_Var59 >> 0x20);
      capnp::_::PointerReader::getStruct
                ((StructReader *)local_1e8,(PointerReader *)local_538,(word *)0x0);
      local_528._8_4_ = local_1c0;
      pWVar51 = local_1d0;
      if (local_1c4 == 0) {
        local_528._8_4_ = 0x7fffffff;
        pWVar51 = (WirePointer *)0x0;
      }
      local_538._0_4_ = 0;
      local_538._4_4_ = 0;
      uStack_530._0_4_ = 0;
      uStack_530._4_4_ = 0;
      if (local_1c4 != 0) {
        local_538._0_4_ = local_1e8._0_4_;
        local_538._4_4_ = local_1e8._4_4_;
        uStack_530._0_4_ = (anon_union_4_5_35ddcec3_for_WirePointer_1)local_1e8._8_4_;
        uStack_530._4_4_ = aStack_1dc;
      }
      local_528._0_4_ = SUB84(pWVar51,0);
      local_528._4_4_ = (undefined4)((ulong)pWVar51 >> 0x20);
      RVar92 = capnp::_::PointerReader::getBlob<capnp::Text>
                         ((PointerReader *)local_538,(void *)0x0,0);
      WVar80.value = local_238.nestingLimit;
      SVar37 = local_238.dataSize;
      pvVar15 = local_238.data;
      WVar83 = (WirePointer)local_238.capTable;
      WVar45 = (WirePointer)local_238.segment;
      uVar57 = uStack_6d4;
      uVar95 = local_6d8._2_2_;
      uVar25 = local_6d8[1];
      bVar89 = local_6d8[0];
      WVar77.field_1.upper32Bits = 0;
      WVar77.offsetAndKind.value = local_238.dataSize;
      local_5a8 = local_578;
      SStack_5a4 = SStack_574;
      EStack_5a2 = EStack_572;
      uStack_5a1 = uStack_571;
      iStack_5a0 = iStack_570;
      uStack_59c = uStack_56c;
      local_5b8.upper32Bits = local_598._16_4_;
      aStack_5b4.upper32Bits = local_598._20_4_;
      uStack_5b0 = local_598._24_4_;
      aStack_5ac.upper32Bits = uStack_57c;
      local_5c8.upper32Bits = local_598._0_4_;
      aStack_5c4.upper32Bits = local_598._4_4_;
      WStack_5c0.value = local_598._8_4_;
      aStack_5bc.upper32Bits = local_598._12_4_;
      local_390 = (WirePointer *)CONCAT44(local_390._4_4_,(uint)uVar2);
      local_6d8[0] = SUB81(this,0);
      bVar24 = local_6d8[0];
      local_6d8[1] = (undefined1)((ulong)this >> 8);
      uVar26 = local_6d8[1];
      local_6d8._2_2_ = (undefined2)((ulong)this >> 0x10);
      uVar27 = local_6d8._2_2_;
      uStack_6d4 = (uint)((ulong)this >> 0x20);
      uVar28 = uStack_6d4;
      uStack_6d4 = uVar57;
      local_6d8[0] = bVar89;
      local_6d8[1] = uVar25;
      local_6d8._2_2_ = uVar95;
      if (local_238.dataSize < 0x10) {
LAB_0012d8af:
        local_5d8 = (WirePointer)local_238.segment;
        local_1f0 = (WirePointer)local_238.capTable;
        WVar61 = (WirePointer)local_238.pointers;
        SVar96 = local_238.pointerCount;
        capnp::_::OrphanBuilder::initStruct
                  ((OrphanBuilder *)local_538,(this->orphanage).arena,(this->orphanage).capTable,
                   (StructSize)0x60006);
        local_718.segment = (SegmentBuilder *)CONCAT44(uStack_530._4_4_,uStack_530._0_4_);
        local_718.capTable = (CapTableBuilder *)CONCAT44(local_528._4_4_,local_528._0_4_);
        local_718.location = (word *)CONCAT44(local_528._12_4_,local_528._8_4_);
        local_718.tag.content = (uint64_t)local_538;
        pAVar60 = (ArrayPtr<const_char> *)0x20002;
        capnp::_::OrphanBuilder::initStruct
                  ((OrphanBuilder *)local_538,(this->orphanage).arena,(this->orphanage).capTable,
                   (StructSize)0x20002);
        local_738.segment = (SegmentBuilder *)CONCAT44(uStack_530._4_4_,uStack_530._0_4_);
        local_738.capTable = (CapTableBuilder *)CONCAT44(local_528._4_4_,local_528._0_4_);
        local_738.location = (word *)CONCAT44(local_528._12_4_,local_528._8_4_);
        local_738.tag.content = (uint64_t)local_538;
        capnp::_::OrphanBuilder::asStruct((StructBuilder *)local_768,&local_718,(StructSize)0x60006)
        ;
        capnp::_::OrphanBuilder::asStructReader
                  ((StructReader *)&stack0xfffffffffffff758,local_2a8,(StructSize)0x60006);
        uStack_530 = (CapTableReader *)(RVar92.super_StringPtr.content.size_ - 1);
        local_6d8[0] = true;
        local_6d8[1] = 0x15;
        local_6d8._2_2_ = 0x1c;
        uStack_6d4 = 0;
        auStack_6d0._0_4_ = 7;
        auStack_6d0._4_4_ = 0;
        local_538 = (undefined1  [8])RVar92.super_StringPtr.content.ptr;
        kj::_::concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
                  (&local_5f8,(_ *)local_538,(ArrayPtr<const_char> *)local_6d8,pAVar60);
        if (local_888 < 0x40) {
          parentId.offsetAndKind.value = 0;
          parentId.field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)0x0;
        }
        else {
          parentId = *(WirePointer *)local_898;
        }
        WVar45 = (WirePointer)generateMethodParamsId((uint64_t)parentId,(uint16_t)local_390,false);
        *(WirePointer *)local_768._16_8_ = WVar45;
        bVar89 = SStack_884 == 0;
        WVar46 = _aStack_890;
        if (bVar89) {
          WVar46.offsetAndKind.value = 0;
          WVar46.field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)0x0;
        }
        local_528._8_4_ = iStack_880;
        if (bVar89) {
          local_528._8_4_ = 0x7fffffff;
        }
        local_538._0_4_ = 0;
        local_538._4_4_ = 0;
        uStack_530._0_4_ = (anon_union_4_5_35ddcec3_for_WirePointer_1)0;
        uStack_530._4_4_ = 0;
        if (!bVar89) {
          local_538._0_4_ = in_stack_fffffffffffff758.value;
          local_538._4_4_ = in_stack_fffffffffffff75c;
          uStack_530._0_4_ =
               (anon_union_4_5_35ddcec3_for_WirePointer_1)WStack_8a0.offsetAndKind.value;
          uStack_530._4_4_ = WStack_8a0.field_1.upper32Bits;
        }
        local_528._0_4_ = WVar46.offsetAndKind.value;
        local_528._4_4_ = WVar46.field_1;
        RVar92 = capnp::_::PointerReader::getBlob<capnp::Text>
                           ((PointerReader *)local_538,(void *)0x0,0);
        local_538 = RVar92.super_StringPtr.content.ptr;
        uStack_530 = (CapTableReader *)(RVar92.super_StringPtr.content.size_ - 1);
        local_868[0] = 0x2e;
        local_568.segment = (SegmentReader *)local_5f8.content.size_;
        if ((WirePointer)local_5f8.content.size_ != (WirePointer)0x0) {
          local_568.segment = (SegmentReader *)local_5f8.content.ptr;
        }
        local_568.capTable._0_4_ = 0;
        local_568.capTable._4_4_ = (anon_union_4_5_35ddcec3_for_WirePointer_1)0x0;
        if ((WirePointer)local_5f8.content.size_ != (WirePointer)0x0) {
          local_568.capTable = (CapTableReader *)(local_5f8.content.size_ + -1);
        }
        kj::_::concat<kj::ArrayPtr<char_const>,kj::FixedArray<char,1ul>,kj::ArrayPtr<char_const>>
                  ((String *)local_6d8,(_ *)local_538,(ArrayPtr<const_char> *)local_868,
                   (FixedArray<char,_1UL> *)&local_568,(ArrayPtr<const_char> *)WVar77);
        lVar42 = CONCAT44(auStack_6d0._4_4_,auStack_6d0._0_4_);
        pcVar75 = "";
        if (lVar42 != 0) {
          pcVar75 = (char *)CONCAT44(uStack_6d4,
                                     CONCAT22(local_6d8._2_2_,CONCAT11(local_6d8[1],local_6d8[0])));
        }
        RVar92.super_StringPtr.content.size_ = lVar42 + (ulong)(lVar42 == 0);
        local_538 = (undefined1  [8])local_768._0_8_;
        uStack_530._0_4_ = SUB84(local_768._8_8_,0);
        uStack_530._4_4_ = SUB84(local_768._8_8_,4);
        local_528._0_4_ = (undefined4)local_768._24_8_;
        local_528._4_4_ = SUB84(local_768._24_8_,4);
        RVar92.super_StringPtr.content.ptr = pcVar75;
        capnp::_::PointerBuilder::setBlob<capnp::Text>((PointerBuilder *)local_538,RVar92);
        lVar42 = CONCAT44(uStack_6d4,CONCAT22(local_6d8._2_2_,CONCAT11(local_6d8[1],local_6d8[0])));
        if (lVar42 != 0) {
          WVar77.field_1.upper32Bits = auStack_6d0._4_4_;
          WVar77.offsetAndKind.value = auStack_6d0._0_4_;
          local_6d8[0] = false;
          local_6d8[1] = 0;
          local_6d8._2_2_ = 0;
          uStack_6d4 = 0;
          auStack_6d0._0_4_ = 0;
          auStack_6d0._4_4_ = 0;
          (*(code *)**(undefined8 **)CONCAT44(auStack_6d0._12_4_,auStack_6d0._8_4_))
                    ((undefined8 *)CONCAT44(auStack_6d0._12_4_,auStack_6d0._8_4_),lVar42,1);
        }
        local_538 = (undefined1  [8])local_768._0_8_;
        uStack_530._0_4_ = SUB84(local_768._8_8_,0);
        uStack_530._4_4_ = SUB84(local_768._8_8_,4);
        local_528._0_4_ = (undefined4)local_768._24_8_;
        local_528._4_4_ = SUB84(local_768._24_8_,4);
        capnp::_::PointerBuilder::getBlob<capnp::Text>
                  ((Builder *)local_6d8,(PointerBuilder *)local_538,(void *)0x0,0);
        uVar57 = 0;
        if ((WirePointer)local_5f8.content.size_ != (WirePointer)0x0) {
          uVar57 = (uint)local_5f8.content.size_ - 1;
        }
        (((WirePointer *)(local_768._16_8_ + 8))->offsetAndKind).value = ~uVar57 + auStack_6d0._8_4_
        ;
        if ((local_888 < 0x121) || (bVar89 = true, (*(byte *)((long)local_898 + 0x24) & 1) == 0)) {
          bVar89 = uStack_5b0 != 0;
        }
        *(byte *)(local_768._16_8_ + 0x24) = *(byte *)(local_768._16_8_ + 0x24) & 0xfe | bVar89;
        ((WirePointer *)(local_768._16_8_ + 0x10))->offsetAndKind = 0;
        ((WirePointer *)(local_768._16_8_ + 0x10))->field_1 =
             (anon_union_4_5_35ddcec3_for_WirePointer_1)0x0;
        if (SVar37 < 0x40) {
          (((WirePointer *)(local_768._16_8_ + 0x28))->offsetAndKind).value = 0;
LAB_0012dc16:
          uVar58 = 0;
          bVar89 = true;
        }
        else {
          (((WirePointer *)(local_768._16_8_ + 0x28))->offsetAndKind).value =
               (uint)*(anon_union_4_5_35ddcec3_for_WirePointer_1 *)((long)pvVar15 + 4);
          if (SVar37 < 0x60) goto LAB_0012dc16;
          uVar58 = *(uint32_t *)((long)pvVar15 + 8);
          bVar89 = false;
        }
        ((anon_union_4_5_35ddcec3_for_WirePointer_1 *)(local_768._16_8_ + 0x2c))->upper32Bits =
             uVar58;
        ((anon_union_4_5_35ddcec3_for_WirePointer_1 *)(local_768._16_8_ + 0xc))->upper32Bits = 1;
        (((WirePointer *)(local_768._16_8_ + 0x18))->offsetAndKind).value = 0;
        *(byte *)(local_768._16_8_ + 0x1c) = *(byte *)(local_768._16_8_ + 0x1c) & 0xfe;
        *(undefined2 *)(local_768._16_8_ + 0x1e) = 0;
        (((WirePointer *)(local_768._16_8_ + 0x20))->offsetAndKind).value = 0;
        local_528._0_8_ = local_768._24_8_ + 0x18;
        local_538 = (undefined1  [8])local_768._0_8_;
        uStack_530._0_4_ = SUB84(local_768._8_8_,0);
        uStack_530._4_4_ = SUB84(local_768._8_8_,4);
        capnp::_::PointerBuilder::clear((PointerBuilder *)local_538);
        capnp::_::OrphanBuilder::asStruct((StructBuilder *)local_538,&local_738,(StructSize)0x20002)
        ;
        uVar58 = 0;
        *(WirePointer *)local_528._0_8_ = *(WirePointer *)local_768._16_8_;
        aVar72.upper32Bits = 0;
        if (0x3f < SVar37) {
          aVar72 = *(anon_union_4_5_35ddcec3_for_WirePointer_1 *)((long)pvVar15 + 4);
        }
        (((WirePointer *)(local_528._0_8_ + 8))->offsetAndKind).value = (uint)aVar72;
        if (!bVar89) {
          uVar58 = *(uint32_t *)((long)pvVar15 + 8);
        }
        ((anon_union_4_5_35ddcec3_for_WirePointer_1 *)(local_528._0_8_ + 0xc))->upper32Bits = uVar58
        ;
        auStack_6d0._48_8_ = CONCAT44(_SStack_5a4,local_5a8);
        auStack_6d0._60_4_ = uStack_59c;
        auStack_6d0._56_4_ = iStack_5a0;
        auStack_6d0._32_4_ = local_5b8;
        auStack_6d0._36_4_ = aStack_5b4;
        auStack_6d0._40_4_ = uStack_5b0;
        auStack_6d0._44_4_ = aStack_5ac;
        auStack_6d0._16_4_ = local_5c8;
        auStack_6d0._20_4_ = aStack_5c4;
        auStack_6d0._24_4_ = WStack_5c0.value;
        auStack_6d0._28_4_ = aStack_5bc;
        auStack_6d0._0_4_ = SUB84(this->errorReporter,0);
        auStack_6d0._4_4_ = (undefined4)((ulong)this->errorReporter >> 0x20);
        auStack_6d0._8_4_ = (*(WirePointer *)local_768._16_8_).offsetAndKind;
        auStack_6d0._12_4_ = (*(WirePointer *)local_768._16_8_).field_1;
        aSStack_690[0]._vptr_StructOrGroup = (_func_int **)&PTR_addVoid_0020ea00;
        aSStack_690[3]._vptr_StructOrGroup = (_func_int **)0x0;
        aSStack_690[4]._vptr_StructOrGroup = (_func_int **)0x0;
        aSStack_690[1]._vptr_StructOrGroup = (_func_int **)0x0;
        aSStack_690[2]._vptr_StructOrGroup = (_func_int **)0x0;
        local_6d8[0] = bVar24;
        local_6d8[1] = uVar26;
        local_6d8._2_2_ = uVar27;
        uStack_6d4 = uVar28;
        kj::Arena::Arena((Arena *)local_668,0x400);
        psVar35 = local_2b8;
        local_648._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        local_648._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_648._M_impl.super__Rb_tree_header._M_header._M_left = local_2b0;
        local_648._M_impl.super__Rb_tree_header._M_header._M_right = local_2b0;
        local_2b8[2] = 0;
        psVar35[3] = 0;
        *psVar35 = 0;
        psVar35[1] = 0;
        local_600 = (ArrayDisposer *)&kj::NullArrayDisposer::instance;
        WVar47 = local_1f0;
        local_538 = (undefined1  [8])local_5d8;
        if (SVar96 == 0) {
          WVar80.value = 0x7fffffff;
          WVar47.offsetAndKind.value = 0;
          WVar47.field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)0x0;
          WVar61.offsetAndKind.value = 0;
          WVar61.field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)0x0;
          local_538._0_4_ = 0;
          local_538._4_4_ = (anon_union_4_5_35ddcec3_for_WirePointer_1)0x0;
        }
        uStack_530._0_4_ = (uint32_t)WVar47.offsetAndKind.value;
        uStack_530._4_4_ = WVar47.field_1;
        local_528._0_4_ = WVar61.offsetAndKind.value;
        local_528._4_4_ = WVar61.field_1;
        local_528._8_4_ = WVar80.value;
        capnp::_::PointerReader::getList
                  (&local_568,(PointerReader *)local_538,INLINE_COMPOSITE,(word *)0x0);
        local_268.offsetAndKind.value = local_768._0_4_;
        local_268.field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)local_768._4_4_;
        WStack_260.offsetAndKind.value = local_768._8_4_;
        WStack_260.field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)local_768._12_4_;
        local_258.offsetAndKind.value = local_768._16_4_;
        local_258.field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)local_768._20_4_;
        WStack_250.offsetAndKind.value = local_768._24_4_;
        WStack_250.field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)local_768._28_4_;
        local_248.offsetAndKind.value = local_768._32_4_;
        local_248.field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)local_768._36_4_;
        capnp::_::OrphanBuilder::asStruct(&local_180,&local_738,(StructSize)0x20002);
        puVar34 = local_2c0;
        local_2c0[4] = local_180._32_8_;
        pWVar51 = local_180.pointers;
        pCVar14 = local_180.capTable;
        pSVar48 = local_180.segment;
        puVar34[2] = local_180.data;
        puVar34[3] = pWVar51;
        *puVar34 = pSVar48;
        puVar34[1] = pCVar14;
        WVar61 = WStack_250;
        WVar67 = local_258;
        WVar83 = WStack_260;
        WVar45 = local_268;
        pWVar51 = local_2c8;
        local_868._0_4_ = local_268.offsetAndKind.value;
        local_868._4_4_ = local_268.field_1;
        local_868._8_4_ = WStack_260.offsetAndKind.value;
        local_868._12_4_ = WStack_260.field_1;
        local_868._16_4_ = local_258.offsetAndKind.value;
        local_868._20_4_ = local_258.field_1;
        local_868._24_4_ = WStack_250.offsetAndKind.value;
        local_868._28_4_ = WStack_250.field_1;
        local_848 = local_248;
        local_2c8[4] = local_248;
        pWVar51[2] = WVar67;
        pWVar51[3] = WVar61;
        *pWVar51 = WVar45;
        pWVar51[1] = WVar83;
        puVar34 = local_2d0;
        local_538 = (undefined1  [8])0x0;
        uStack_530._0_4_ = (anon_union_4_5_35ddcec3_for_WirePointer_1)0x0;
        uStack_530._4_4_ = (anon_union_4_5_35ddcec3_for_WirePointer_1)0x0;
        local_528._0_4_ = 0;
        local_528._4_4_ = 0;
        local_528._8_4_ = 0;
        local_528._12_4_ = local_528._12_4_ & 0xffffff00;
        local_528._16_4_ = 0x1d857d;
        local_528._20_2_ = 0;
        local_528._22_2_ = 0;
        local_528._24_4_ = 1;
        local_528._28_4_ = 0;
        local_528._64_6_ = 0;
        local_528._48_8_ = 0;
        local_528._56_6_ = 0;
        local_528._62_2_ = 0;
        local_528._32_4_ = 0;
        local_528._36_4_ = 0;
        local_528._40_4_ = 0;
        local_528._44_4_ = 0;
        local_528._72_4_ = 0x7fffffff;
        local_528._82_2_ = 0;
        local_4b8._8_4_ = 0;
        local_4b8._12_2_ = 0;
        pBStack_4c0 = (BrandScope *)0x0;
        local_4b8._0_6_ = 0;
        local_4b8._6_2_ = 0;
        local_528._88_8_ = 0;
        local_4c8 = (CapTableReader *)0x0;
        local_4b8._16_4_ = 0x7fffffff;
        *(undefined8 *)((long)local_2d0 + 0x1e) = 0;
        puVar34[2] = 0;
        puVar34[3] = 0;
        *puVar34 = 0;
        puVar34[1] = 0;
        puVar34 = local_2d8;
        local_4b8._64_4_ = 0x7fffffff;
        *(undefined8 *)((long)local_2d8 + 0x1e) = 0;
        puVar34[2] = 0;
        puVar34[3] = 0;
        *puVar34 = 0;
        puVar34[1] = 0;
        puVar34 = local_2e0;
        local_4b8[0x6e] = INLINE_COMPOSITE;
        local_4b8._112_4_ = 0x7fffffff;
        local_4b8[0x98] = false;
        *(undefined1 *)(local_2e0 + 1) = 0;
        *puVar34 = 0;
        local_3a0.fieldScope = (StructOrGroup *)0x0;
        params_00.reader.step = local_568.step;
        params_00.reader.elementCount = local_568.elementCount;
        params_00.reader.capTable = local_568.capTable;
        params_00.reader.segment = local_568.segment;
        params_00.reader.ptr = local_568.ptr;
        params_00.reader.structDataSize = local_568.structDataSize;
        params_00.reader.structPointerCount = local_568.structPointerCount;
        params_00.reader.elementSize = local_568.elementSize;
        params_00.reader._39_1_ = local_568._39_1_;
        params_00.reader.nestingLimit = local_568.nestingLimit;
        params_00.reader._44_4_ = local_568._44_4_;
        StructTranslator::traverseParams
                  ((StructTranslator *)local_6d8,params_00,(MemberInfo *)local_538,aSStack_690);
        builder_00._builder.capTable = (CapTableBuilder *)local_868._8_8_;
        builder_00._builder.segment = (SegmentBuilder *)local_868._0_8_;
        builder_00._builder.data = (void *)local_868._16_8_;
        builder_00._builder.pointers = (WirePointer *)local_868._24_8_;
        builder_00._builder._32_8_ = local_848;
        StructTranslator::translateInternal
                  ((StructTranslator *)local_6d8,(MemberInfo *)local_538,builder_00);
        pppMVar33 = local_2e8;
        ppMVar31 = ppMStack_608;
        ppMVar30 = local_610;
        ppMVar29 = ppMStack_618;
        if (ppMStack_618 != (MemberInfo **)0x0) {
          *local_2e8 = (MemberInfo **)0x0;
          pppMVar33[1] = (MemberInfo **)0x0;
          pppMVar33[2] = (MemberInfo **)0x0;
          WVar77 = (WirePointer)((long)ppMVar31 - (long)ppMVar29 >> 3);
          (*(code *)**(undefined8 **)local_600)
                    (local_600,ppMVar29,8,(long)ppMVar30 - (long)ppMVar29 >> 3);
        }
        std::
        _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_capnp::compiler::NodeTranslator::StructTranslator::MemberInfo_*>,_std::_Select1st<std::pair<const_unsigned_int,_capnp::compiler::NodeTranslator::StructTranslator::MemberInfo_*>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_capnp::compiler::NodeTranslator::StructTranslator::MemberInfo_*>_>_>
        ::~_Rb_tree(local_398);
        kj::Arena::~Arena((Arena *)local_668);
        pwVar23 = local_718.location;
        pCVar22 = local_718.capTable;
        pSVar76 = local_718.segment;
        wVar21.content = local_718.tag.content;
        pwVar20 = local_738.location;
        pCVar14 = local_738.capTable;
        pSVar48 = local_738.segment;
        wVar19.content = local_738.tag.content;
        local_5d8 = *(WirePointer *)local_768._16_8_;
        uStack_530._0_4_ = (uint32_t)local_718.segment;
        uStack_530._4_4_ = (uint32_t)((ulong)local_718.segment >> 0x20);
        local_528._0_4_ = SUB84(local_718.capTable,0);
        local_528._4_4_ = (undefined4)((ulong)local_718.capTable >> 0x20);
        local_528._8_4_ = SUB84(local_718.location,0);
        local_528._12_4_ = (undefined4)((ulong)local_718.location >> 0x20);
        local_538 = (undefined1  [8])local_718.tag.content;
        local_718.segment = (SegmentBuilder *)0x0;
        local_718.location = (word *)0x0;
        local_528._24_4_ = SUB84(local_738.segment,0);
        local_528._28_4_ = (undefined4)((ulong)local_738.segment >> 0x20);
        local_528._32_4_ = SUB84(local_738.capTable,0);
        local_528._36_4_ = (undefined4)((ulong)local_738.capTable >> 0x20);
        local_528._40_4_ = SUB84(local_738.location,0);
        local_528._44_4_ = (undefined4)((ulong)local_738.location >> 0x20);
        local_528._16_4_ = (undefined4)local_738.tag.content;
        local_528._20_2_ = (undefined2)(local_738.tag.content >> 0x20);
        local_528._22_2_ = (undefined2)(local_738.tag.content >> 0x30);
        local_738.segment = (SegmentBuilder *)0x0;
        local_738.location = (word *)0x0;
        pRVar53 = (this->paramStructs).builder.pos;
        if (pRVar53 == (this->paramStructs).builder.endPtr) {
          sVar73 = (long)pRVar53 -
                   (long)*(RemoveConst<capnp::compiler::NodeTranslator::AuxNode> **)local_2f0 >> 5;
          if (pRVar53 == *(RemoveConst<capnp::compiler::NodeTranslator::AuxNode> **)local_2f0) {
            sVar73 = 4;
          }
          kj::Vector<capnp::compiler::NodeTranslator::AuxNode>::setCapacity
                    ((Vector<capnp::compiler::NodeTranslator::AuxNode> *)local_2f0,sVar73);
          pRVar53 = (this->paramStructs).builder.pos;
        }
        (pRVar53->node).builder.segment = pSVar76;
        (pRVar53->node).builder.capTable = pCVar22;
        (pRVar53->node).builder.location = pwVar23;
        (pRVar53->node).builder.tag.content = wVar21.content;
        (pRVar53->sourceInfo).builder.segment = pSVar48;
        (pRVar53->sourceInfo).builder.capTable = pCVar14;
        (pRVar53->sourceInfo).builder.location = pwVar20;
        (pRVar53->sourceInfo).builder.tag.content = wVar19.content;
        ppRVar1 = &(this->paramStructs).builder.pos;
        *ppRVar1 = *ppRVar1 + 1;
        BrandScope::push((BrandScope *)local_778,(uint64_t)(this->localBrand).ptr,
                         (*(WirePointer *)local_768._16_8_).offsetAndKind.value);
        uVar65 = (ulong)uStack_5b0;
        if (uVar65 != 0) {
          WVar77.offsetAndKind.value = 0;
          WVar77.field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)0x0;
          pSVar48 = (SegmentBuilder *)
                    kj::_::HeapArrayDisposer::allocateImpl
                              (0xa8,0,uVar65,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
          local_808.data = pSVar48 + uVar65 * 3;
          local_808.pointers = (WirePointer *)&kj::_::HeapArrayDisposer::instance;
          local_528._0_8_ = local_768._24_8_ + 0x28;
          local_538 = (undefined1  [8])local_768._0_8_;
          uStack_530._0_4_ = SUB84(local_768._8_8_,0);
          uStack_530._4_4_ = SUB84(local_768._8_8_,4);
          local_808.segment = pSVar48;
          local_808.capTable = (CapTableBuilder *)pSVar48;
          capnp::_::PointerBuilder::initStructList
                    ((ListBuilder *)local_6d8,(PointerBuilder *)local_538,uStack_5b0,
                     (StructSize)0x10000);
          uVar65 = (ulong)uStack_5b0;
          WVar45 = (WirePointer)&kj::_::HeapArrayDisposer::instance;
          pSVar76 = pSVar48;
          if (uVar65 != 0) {
            uVar86 = 0;
            do {
              EVar87 = (ElementCount)uVar86;
              capnp::_::ListReader::getStructElement
                        ((StructReader *)local_538,(ListReader *)&local_5c8.structRef,EVar87);
              *(undefined4 *)&((SegmentReader *)&(local_808.capTable)->super_CapTableReader)->arena
                   = 2;
              *(undefined8 *)&((SegmentReader *)&(local_808.capTable)->super_CapTableReader)->id = 0
              ;
              *(ElementCount *)
               &(((SegmentReader *)&(local_808.capTable)->super_CapTableReader)->ptr).ptr = EVar87;
              *(undefined8 *)&((SegmentBuilder *)((long)local_808.capTable + 0x38))->readOnly = 0;
              (((SegmentBuilder *)((long)local_808.capTable + 0x70))->super_SegmentReader).arena =
                   (Arena *)0x0;
              *(undefined8 *)
               &(((SegmentBuilder *)((long)local_808.capTable + 0x70))->super_SegmentReader).id = 0;
              (((SegmentBuilder *)((long)local_808.capTable + 0x70))->super_SegmentReader).ptr.ptr =
                   (word *)0x0;
              (((SegmentBuilder *)((long)local_808.capTable + 0x70))->super_SegmentReader).ptr.size_
                   = 0;
              (((SegmentBuilder *)((long)local_808.capTable + 0x70))->super_SegmentReader).
              readLimiter = (ReadLimiter *)0x0;
              ((SegmentBuilder *)((long)local_808.capTable + 0x70))->pos = (word *)0x0;
              *(undefined8 *)&((SegmentBuilder *)((long)local_808.capTable + 0x70))->readOnly =
                   0x7fffffff;
              local_808.capTable = (CapTableBuilder *)((long)local_808.capTable + 0xa8);
              capnp::_::ListBuilder::getStructElement
                        ((StructBuilder *)local_868,(ListBuilder *)local_6d8,EVar87);
              aStack_790 = (anon_union_4_5_35ddcec3_for_WirePointer_1)local_528._24_4_;
              local_798 = (WirePointer)CONCAT44(local_528._12_4_,local_528._8_4_);
              if (local_528._20_2_ == 0) {
                aStack_790.upper32Bits = 0x7fffffff;
                local_798 = (WirePointer)(WirePointer *)0x0;
              }
              local_7a8._0_4_ = 0;
              local_7a8._4_4_ = 0;
              WStack_7a0.offsetAndKind.value = 0;
              WStack_7a0.field_1.upper32Bits = 0;
              if (local_528._20_2_ != 0) {
                local_7a8._0_4_ = local_538._0_4_;
                local_7a8._4_4_ = local_538._4_4_;
                WStack_7a0.offsetAndKind.value = (uint)uStack_530._0_4_;
                WStack_7a0.field_1 = uStack_530._4_4_;
              }
              RVar92 = capnp::_::PointerReader::getBlob<capnp::Text>
                                 ((PointerReader *)local_7a8,(void *)0x0,0);
              local_7a8 = (undefined1  [8])local_868._0_8_;
              WStack_7a0.offsetAndKind.value = local_868._8_4_;
              WStack_7a0.field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)local_868._12_4_;
              local_798.offsetAndKind.value = local_868._24_4_;
              local_798.field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)local_868._28_4_;
              capnp::_::PointerBuilder::setBlob<capnp::Text>((PointerBuilder *)local_7a8,RVar92);
              uVar86 = uVar86 + 1;
              WVar45 = (WirePointer)local_808.pointers;
              pSVar48 = local_808.segment;
              pSVar76 = (SegmentBuilder *)local_808.capTable;
            } while (uVar65 != uVar86);
          }
          WStack_6f0 = (WirePointer)(((long)pSVar76 - (long)pSVar48 >> 3) * -0x30c30c30c30c30c3);
          local_808.segment = (SegmentBuilder *)0x0;
          local_808.capTable = (CapTableBuilder *)0x0;
          local_808.data = (void *)0x0;
          local_528._16_4_ = 0;
          local_528._20_2_ = 0;
          local_528._22_2_ = 0;
          local_528._28_4_ = 0;
          local_538 = (undefined1  [8])0x0;
          uStack_530._0_4_ = 0;
          uStack_530._4_4_ = 0;
          local_528._0_4_ = 0;
          local_528._4_4_ = 0;
          local_528._8_4_ = 0;
          local_528._12_4_ = 0;
          local_528._24_4_ = 0x7fffffff;
          auVar10 = ZEXT1640(ZEXT816(0)) << 0x40;
          source_00._reader._40_8_ = 0x7fffffff;
          source_00._reader.segment = (SegmentReader *)auVar10._0_8_;
          source_00._reader.capTable = (CapTableReader *)auVar10._8_8_;
          source_00._reader.data = (void *)auVar10._16_8_;
          source_00._reader.pointers = (WirePointer *)auVar10._24_8_;
          source_00._reader.dataSize = auVar10._32_4_;
          source_00._reader.pointerCount = auVar10._36_2_;
          source_00._reader._38_2_ = auVar10._38_2_;
          local_6f8 = pSVar48;
          local_6e8 = WVar45;
          BrandScope::setParams
                    ((BrandScope *)local_338,(Array<capnp::compiler::BrandedDecl> *)local_770,
                     (Which)&local_6f8,source_00);
          plVar32 = local_330;
          if (local_330 != (long *)0x0) {
            local_330 = (long *)0x0;
            (**(code **)*(_func_int **)local_338)
                      (local_338,(long)plVar32 + *(long *)(*plVar32 + -0x10));
          }
          WVar45 = WStack_6f0;
          pSVar48 = local_6f8;
          if (local_6f8 != (SegmentBuilder *)0x0) {
            local_6f8 = (SegmentBuilder *)0x0;
            WStack_6f0.offsetAndKind.value = 0;
            WStack_6f0.field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)0x0;
            (**(code **)*(WirePointer *)local_6e8)(local_6e8,pSVar48,0xa8);
            WVar77 = WVar45;
          }
        }
        pBVar70 = local_770;
        local_7c8.builder.ptr = (BrandScope **)0x0;
        local_7c8.builder.pos = (BrandScope **)0x0;
        local_7c8.builder.endPtr = (BrandScope **)0x0;
        local_7c8.builder.disposer = (ArrayDisposer *)&kj::NullArrayDisposer::instance;
        ppBVar49 = (BrandScope **)0x0;
        pBVar69 = local_770;
        do {
          if (((pBVar69->params).size_ != 0) ||
             ((pBVar69->inherited == true && (pBVar69->leafParamCount != 0)))) {
            if (ppBVar49 == local_7c8.builder.endPtr) {
              sVar73 = (long)ppBVar49 - (long)local_7c8.builder.ptr >> 2;
              if (ppBVar49 == local_7c8.builder.ptr) {
                sVar73 = 4;
              }
              kj::Vector<capnp::compiler::BrandScope_*>::setCapacity(&local_7c8,sVar73);
              ppBVar49 = local_7c8.builder.pos;
            }
            *ppBVar49 = pBVar69;
            ppBVar49 = local_7c8.builder.pos + 1;
            local_7c8.builder.pos = ppBVar49;
          }
          pBVar69 = (pBVar69->parent).ptr.ptr;
        } while (pBVar69 != (BrandScope *)0x0);
        if (ppBVar49 != local_7c8.builder.ptr) {
          local_798 = (WirePointer)(local_328.pointers + 2);
          local_7a8 = (undefined1  [8])local_328.segment;
          WStack_7a0 = (WirePointer)local_328.capTable;
          capnp::_::PointerBuilder::initStruct
                    ((StructBuilder *)local_868,(PointerBuilder *)local_7a8,(StructSize)0x10000);
          local_7a8 = (undefined1  [8])local_868._0_8_;
          WStack_7a0.offsetAndKind.value = local_868._8_4_;
          WStack_7a0.field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)local_868._12_4_;
          local_798.offsetAndKind.value = local_868._24_4_;
          local_798.field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)local_868._28_4_;
          capnp::_::PointerBuilder::initStructList
                    ((ListBuilder *)local_6d8,(PointerBuilder *)local_7a8,
                     (ElementCount)
                     ((ulong)((long)local_7c8.builder.pos - (long)local_7c8.builder.ptr) >> 3),
                     (StructSize)0x10002);
          lVar42 = (long)local_7c8.builder.pos - (long)local_7c8.builder.ptr;
          if (lVar42 != 0) {
            uVar65 = lVar42 >> 3;
            uVar86 = 0;
            uVar95 = (undefined2)uVar65;
            iVar97 = (int6)(lVar42 >> 0x13);
            do {
              capnp::_::ListBuilder::getStructElement
                        ((StructBuilder *)local_868,(ListBuilder *)local_6d8,(ElementCount)uVar86);
              uVar82 = uVar86 & 0xffffffff;
              pBVar69 = local_7c8.builder.ptr[uVar82];
              *(uint64_t *)local_868._16_8_ = pBVar69->leafId;
              if (pBVar69->inherited == true) {
                *(undefined2 *)&(((WirePointer *)(local_868._16_8_ + 8))->offsetAndKind).value = 1;
              }
              else {
                sVar73 = (pBVar69->params).size_;
                *(undefined2 *)&(((WirePointer *)(local_868._16_8_ + 8))->offsetAndKind).value = 0;
                local_838.segment = (SegmentBuilder *)local_868._0_8_;
                local_838.capTable = (CapTableBuilder *)local_868._8_8_;
                local_838.data = (void *)local_868._24_8_;
                capnp::_::PointerBuilder::initStructList
                          ((ListBuilder *)local_7a8,(PointerBuilder *)&local_838,
                           (ElementCount)sVar73,(StructSize)0x10001);
                uVar65 = (ulong)aStack_790.upper32Bits;
                if (uVar65 != 0) {
                  lVar42 = 0;
                  uVar88 = 0;
                  do {
                    pBVar4 = (local_7c8.builder.ptr[uVar82]->params).ptr;
                    pAVar5 = (ArrayDisposer *)pBVar70->errorReporter;
                    capnp::_::ListBuilder::getStructElement
                              (&local_838,(ListBuilder *)local_7a8,(ElementCount)uVar88);
                    *(undefined2 *)local_838.data = 1;
                    local_208.segment = local_838.segment;
                    local_208.capTable = local_838.capTable;
                    local_208.pointer = local_838.pointers;
                    capnp::_::PointerBuilder::initStruct(&local_808,&local_208,(StructSize)0x10003);
                    target_00._builder.capTable = local_808.capTable;
                    target_00._builder.segment = local_808.segment;
                    target_00._builder.data = local_808.data;
                    target_00._builder.pointers = local_808.pointers;
                    target_00._builder.dataSize = local_808.dataSize;
                    target_00._builder.pointerCount = local_808.pointerCount;
                    target_00._builder._38_2_ = local_808._38_2_;
                    BrandedDecl::compileAsType
                              ((BrandedDecl *)((long)&(pBVar4->body).tag + lVar42),
                               (ErrorReporter *)pAVar5,target_00);
                    uVar88 = uVar88 + 1;
                    lVar42 = lVar42 + 0xa8;
                  } while (uVar65 != uVar88);
                }
                uVar65 = CONCAT62(iVar97,uVar95);
              }
              uVar86 = uVar86 + 1;
            } while (uVar86 != uVar65);
          }
        }
        ppBVar17 = local_7c8.builder.endPtr;
        ppBVar49 = local_7c8.builder.ptr;
        if (local_7c8.builder.ptr != (BrandScope **)0x0) {
          local_7c8.builder.ptr = (BrandScope **)0x0;
          local_7c8.builder.pos = (BrandScope **)0x0;
          local_7c8.builder.endPtr = (BrandScope **)0x0;
          WVar77 = (WirePointer)((long)ppBVar17 - (long)ppBVar49 >> 3);
          (*(code *)**(undefined8 **)local_7c8.builder.disposer)
                    (local_7c8.builder.disposer,ppBVar49,8);
        }
        pBVar69 = local_770;
        if (local_770 != (BrandScope *)0x0) {
          local_770 = (BrandScope *)0x0;
          (**(code **)*(_func_int **)local_778)
                    (local_778,
                     (long)&(pBVar69->super_Refcounted).super_Disposer._vptr_Disposer +
                     *(long *)&((BrandedDecl *)
                               (pBVar69->super_Refcounted).super_Disposer._vptr_Disposer)[-1].source
                               ._reader.dataSize);
        }
        WVar45 = (WirePointer)local_5f8.content.size_;
        pcVar75 = local_5f8.content.ptr;
        if ((WirePointer)local_5f8.content.ptr != (WirePointer)0x0) {
          local_5f8.content.ptr = (char *)0x0;
          local_5f8.content.size_._0_4_ = 0;
          local_5f8.content.size_._4_4_ = (anon_union_4_5_35ddcec3_for_WirePointer_1)0x0;
          (*(code *)**(undefined8 **)local_5f8.content.disposer)
                    (local_5f8.content.disposer,pcVar75,1);
          WVar77 = WVar45;
        }
        WVar67 = local_5d8;
        if (local_738.segment != (SegmentBuilder *)0x0) {
          capnp::_::OrphanBuilder::euthanize(&local_738);
        }
        if (local_718.segment != (SegmentBuilder *)0x0) {
          capnp::_::OrphanBuilder::euthanize(&local_718);
        }
      }
      else {
        sVar3 = (short)((WireValue<uint32_t> *)local_238.data)->value;
        if (sVar3 == 2) {
          (*this->resolver->_vptr_Resolver[8])
                    ((MemberInfo *)local_538,this->resolver,"/capnp/stream.capnp",0x14);
          if (local_538[0] == '\x01') {
            (**(code **)(*(long *)CONCAT44(local_528._28_4_,local_528._24_4_) + 8))
                      ((MemberInfo *)local_538,(long *)CONCAT44(local_528._28_4_,local_528._24_4_),
                       "StreamResult");
            WVar67.offsetAndKind.value = 0x77c0b16e;
            WVar67.field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)0x995f9a33;
            if (local_538[0] != '\0') goto LAB_0012f18c;
            pEVar68 = this->errorReporter;
            WVar77.offsetAndKind.value = 0x96;
            WVar77.field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)0x0;
            uVar65 = 0;
            if (0x3f < SVar37) {
              uVar57 = ((anon_union_4_5_35ddcec3_for_WirePointer_1 *)((long)pvVar15 + 4))->
                       upper32Bits;
              goto LAB_0012ef29;
            }
            uVar86 = 0;
          }
          else {
            pEVar68 = this->errorReporter;
            WVar77.offsetAndKind.value = 0xb7;
            WVar77.field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)0x0;
            uVar65 = 0;
            if (SVar37 < 0x40) {
              uVar86 = 0;
            }
            else {
              uVar57 = ((anon_union_4_5_35ddcec3_for_WirePointer_1 *)((long)pvVar15 + 4))->
                       upper32Bits;
LAB_0012ef29:
              uVar86 = (ulong)uVar57;
              uVar65 = 0;
              if (0x5f < SVar37) {
                uVar65 = (ulong)*(uint *)((long)pvVar15 + 8);
              }
            }
          }
          (**pEVar68->_vptr_ErrorReporter)(pEVar68,uVar86,uVar65);
          WVar67.offsetAndKind.value = 0x77c0b16e;
          WVar67.field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)0x995f9a33;
        }
        else {
          if (sVar3 != 1) {
            if (sVar3 != 0) {
              kj::_::unreachable();
            }
            goto LAB_0012d8af;
          }
          WVar66 = (WirePointer)local_238.pointers;
          SVar96 = local_238.pointerCount;
          capnp::_::PointerReader::getStruct
                    ((StructReader *)&local_568,(PointerReader *)&stack0xfffffffffffff758,
                     (word *)0x0);
          aVar72 = aStack_5b4;
          WStack_8a0.field_1.upper32Bits = aStack_5c4.upper32Bits;
          WStack_8a0.offsetAndKind.value = local_5c8.upper32Bits;
          local_898.field_1.upper32Bits = aStack_5bc.upper32Bits;
          local_898.offsetAndKind.value = WStack_5c0.value;
          aStack_88c.upper32Bits = aStack_5b4.upper32Bits;
          aStack_890.upper32Bits = local_5b8.upper32Bits;
          unique0x10007019 = aStack_5ac.upper32Bits;
          local_888 = uStack_5b0;
          unique0x10007041 = SStack_5a4;
          unique0x10007043 = EStack_5a2;
          unique0x10007044 = uStack_5a1;
          iStack_880 = local_5a8;
          auVar11._44_4_ = uStack_59c;
          auVar11._40_4_ = iStack_5a0;
          in_stack_fffffffffffff758.value = 0;
          in_stack_fffffffffffff75c.upper32Bits = 0;
          source_01._reader.pointers._4_4_ = local_568.step;
          source_01._reader.pointers._0_4_ = local_568.elementCount;
          source_01._reader.capTable = local_568.capTable;
          source_01._reader.segment = local_568.segment;
          source_01._reader.data = local_568.ptr;
          source_01._reader.dataSize = local_568.structDataSize;
          source_01._reader.pointerCount = local_568.structPointerCount;
          source_01._reader._38_1_ = local_568.elementSize;
          source_01._reader._39_1_ = local_568._39_1_;
          source_01._reader.nestingLimit = local_568.nestingLimit;
          source_01._reader._44_4_ = local_568._44_4_;
          auVar11._8_4_ = WStack_5c0.value;
          auVar11._12_4_ = aStack_5bc;
          auVar11._0_4_ = local_5c8;
          auVar11._4_4_ = aStack_5c4;
          auVar11._16_4_ = local_5b8;
          auVar11._20_4_ = aStack_5b4;
          auVar11._24_4_ = uStack_5b0;
          auVar11._28_2_ = aStack_5ac._0_2_;
          auVar11._30_2_ = aStack_5ac._2_2_;
          auVar11._32_8_ = _iStack_880;
          auVar11._48_8_ = 0;
          BrandScope::compileDeclExpression
                    ((Maybe<capnp::compiler::BrandedDecl> *)local_6d8,(this->localBrand).ptr,
                     source_01,this->resolver,(ImplicitParams)(auVar11 << 0x40));
          pBVar4 = local_300;
          local_538[0] = local_6d8[0];
          if (local_6d8[0] == true) {
            uStack_530._0_4_ = auStack_6d0._0_4_;
            if (auStack_6d0._0_4_ == 2) {
              local_528._0_4_ = auStack_6d0._8_4_;
              local_528._4_4_ = auStack_6d0._12_4_;
              local_528._8_4_ = auStack_6d0._16_4_;
              local_528._12_4_ = auStack_6d0._20_4_;
            }
            else if (auStack_6d0._0_4_ == 1) {
              local_528._32_4_ = auStack_6d0._40_4_;
              local_528._36_4_ = auStack_6d0._44_4_;
              local_528._16_4_ = auStack_6d0._24_4_;
              local_528._20_2_ = (undefined2)auStack_6d0._28_4_;
              local_528._22_2_ = SUB42(auStack_6d0._28_4_,2);
              local_528._24_4_ = auStack_6d0._32_4_;
              local_528._28_4_ = auStack_6d0._36_4_;
              local_528._0_4_ = auStack_6d0._8_4_;
              local_528._4_4_ = auStack_6d0._12_4_;
              local_528._8_4_ = auStack_6d0._16_4_;
              local_528._12_4_ = auStack_6d0._20_4_;
              local_528.space[0x28] = auStack_6d0[0x30];
              if (auStack_6d0[0x30] == '\x01') {
                local_528._80_8_ = aSStack_690[3]._vptr_StructOrGroup;
                local_528._88_8_ = aSStack_690[4]._vptr_StructOrGroup;
                local_528._64_6_ = SUB86(aSStack_690[1]._vptr_StructOrGroup,0);
                local_528._70_2_ = (undefined2)((ulong)aSStack_690[1]._vptr_StructOrGroup >> 0x30);
                local_528._72_8_ = aSStack_690[2]._vptr_StructOrGroup;
                local_528._48_8_ = auStack_6d0._56_8_;
                local_528._56_6_ = SUB86(aSStack_690[0]._vptr_StructOrGroup,0);
                local_528._62_2_ = (undefined2)((ulong)aSStack_690[0]._vptr_StructOrGroup >> 0x30);
                auStack_6d0._48_8_ = auStack_6d0._48_8_ & 0xffffffffffffff00;
              }
            }
            local_4c8 = (CapTableReader *)local_668._0_8_;
            pBStack_4c0 = (BrandScope *)local_668._8_8_;
            uVar78 = *local_2f8;
            uVar93 = local_2f8[1];
            uVar94 = local_2f8[2];
            uVar8 = local_2f8[3];
            uVar9 = local_2f8[5];
            *(undefined8 *)((long)&(local_300->body).field_1 + 0x18) = local_2f8[4];
            *(undefined8 *)((long)&(pBVar4->body).field_1 + 0x20) = uVar9;
            *(undefined8 *)((long)&(pBVar4->body).field_1 + 8) = uVar94;
            *(undefined8 *)((long)&(pBVar4->body).field_1 + 0x10) = uVar8;
            *(undefined8 *)&pBVar4->body = uVar78;
            *(undefined8 *)&(pBVar4->body).field_1 = uVar93;
            BrandedDecl::getKind((BrandedDecl *)&uStack_530);
            pBVar69 = pBStack_4c0;
            if (local_6d8[0] != true) {
              uVar65 = 0;
              if ((uint)local_4b8._32_4_ < 0x40) {
                uVar86 = 0;
              }
              else {
                uVar86 = (ulong)*(uint *)(CONCAT44(local_4b8._20_4_,local_4b8._16_4_) + 4);
                if (0x9f < (uint)local_4b8._32_4_) {
                  uVar65 = (ulong)*(uint *)(CONCAT44(local_4b8._20_4_,local_4b8._16_4_) + 0x10);
                }
              }
              WVar77.offsetAndKind.value = 0x8b;
              WVar77.field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)0x0;
              (**this->errorReporter->_vptr_ErrorReporter)(this->errorReporter,uVar86,uVar65);
              goto LAB_0012f153;
            }
            if (local_6d8._2_2_ != 5) {
              local_5d8 = WVar45;
              WStack_8a0 = WVar83;
              local_898 = WVar66;
              aStack_890 = (anon_union_4_5_35ddcec3_for_WirePointer_1)WVar80.value;
              if (SVar96 == 0) {
                WStack_8a0.offsetAndKind.value = 0;
                WStack_8a0.field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)0x0;
                local_898.offsetAndKind.value = 0;
                local_898.field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)0x0;
                WVar45.offsetAndKind.value = 0;
                WVar45.field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)0x0;
                aStack_890 = (anon_union_4_5_35ddcec3_for_WirePointer_1)0x7fffffff;
              }
              pEVar68 = this->errorReporter;
              in_stack_fffffffffffff758 = WVar45.offsetAndKind.value;
              in_stack_fffffffffffff75c = WVar45.field_1;
              aStack_88c.upper32Bits = aVar72.upper32Bits;
              WVar45 = WVar66;
              capnp::_::PointerReader::getStruct
                        ((StructReader *)local_6d8,(PointerReader *)&stack0xfffffffffffff758,
                         (word *)0x0);
              local_868._0_8_ = local_5d8;
              if (SVar96 == 0) {
                WVar80.value = 0x7fffffff;
                WVar83.offsetAndKind.value = 0;
                WVar83.field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)0x0;
                WVar66.offsetAndKind.value = 0;
                WVar66.field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)0x0;
                local_868._0_4_ = 0;
                local_868._4_4_ = (anon_union_4_5_35ddcec3_for_WirePointer_1)0x0;
              }
              local_868._24_4_ = WVar80.value;
              local_868._8_8_ = WVar83;
              local_868._16_8_ = WVar66;
              capnp::_::PointerReader::getStruct
                        ((StructReader *)&stack0xfffffffffffff758,(PointerReader *)local_868,
                         (word *)0x0);
              uVar78 = CONCAT44(in_stack_fffffffffffff75c.upper32Bits,
                                in_stack_fffffffffffff758.value);
              name._reader.capTable._0_2_ = SVar96;
              name._reader.segment = (SegmentReader *)WVar45;
              name._reader.capTable._2_6_ = iVar97;
              name._reader.data._0_4_ = uVar91;
              name._reader.data._4_4_ = aVar98.upper32Bits;
              name._reader.pointers = (WirePointer *)p_Var100;
              name._reader._32_8_ = p_Var62;
              name._reader.nestingLimit = in_stack_fffffffffffff758.value;
              name._reader._44_4_ = in_stack_fffffffffffff75c.upper32Bits;
              WVar45 = WStack_8a0;
              WVar83 = local_898;
              WVar67 = _aStack_890;
              uVar93 = _local_888;
              uVar94 = _iStack_880;
              expressionString(name);
              kj::str<char_const(&)[2],kj::String,char_const(&)[24]>
                        ((String *)local_7a8,(kj *)0x1c0ea5,(char (*) [2])&local_808,
                         (String *)"\' is not a struct type.",(char (*) [24])WVar77);
              WVar77 = (WirePointer)((long)WStack_7a0 + (ulong)(WStack_7a0 == (WirePointer)0x0));
              uVar65 = 0;
              if ((uint)auStack_6d0._24_4_ < 0x40) {
                uVar86 = 0;
              }
              else {
                uVar86 = (ulong)*(uint *)(CONCAT44(auStack_6d0._12_4_,auStack_6d0._8_4_) + 4);
                if (0x9f < (uint)auStack_6d0._24_4_) {
                  uVar65 = (ulong)*(uint *)(CONCAT44(auStack_6d0._12_4_,auStack_6d0._8_4_) + 0x10);
                }
              }
              (**pEVar68->_vptr_ErrorReporter)(pEVar68,uVar86,uVar65);
              WVar61 = WStack_7a0;
              auVar18 = local_7a8;
              if ((WirePointer)local_7a8 != (WirePointer)0x0) {
                local_7a8._0_4_ = 0;
                local_7a8._4_4_ = (anon_union_4_5_35ddcec3_for_WirePointer_1)0x0;
                WStack_7a0.offsetAndKind.value = 0;
                WStack_7a0.field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)0x0;
                (*(code *)**(undefined8 **)local_798)
                          (local_798,auVar18,1,WVar61,WVar61,0,uVar78,WVar45,WVar83,WVar67,uVar93,
                           uVar94);
                WVar77 = WVar61;
              }
              WVar45 = (WirePointer)local_808.capTable;
              pSVar48 = local_808.segment;
              if ((WirePointer)local_808.segment != (WirePointer)0x0) {
                local_808.segment = (SegmentBuilder *)0x0;
                local_808.capTable = (CapTableBuilder *)0x0;
                (**(code **)*local_808.data)(local_808.data,pSVar48,1);
                WVar77 = WVar45;
              }
              goto LAB_0012f153;
            }
            in_stack_fffffffffffff758.value =
                 CONCAT31((int3)(in_stack_fffffffffffff758.value >> 8),uStack_530._0_4_ == 1);
            if (uStack_530._0_4_ != 1) {
              kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&>
                        ((Fault *)local_6d8,
                         "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compiler/generics.h"
                         ,0x115,FAILED,"body.is<Resolver::ResolvedDecl>()","_kjCondition,",
                         (DebugExpression<bool> *)&stack0xfffffffffffff758);
              kj::_::Debug::Fault::fatal((Fault *)local_6d8);
            }
            local_838.segment = (SegmentBuilder *)0x0;
            local_838.capTable = (CapTableBuilder *)0x0;
            local_838.data = (void *)0x0;
            local_838.pointers = (WirePointer *)&kj::NullArrayDisposer::instance;
            WVar50.offsetAndKind.value = 0;
            WVar50.field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)0x0;
            pBVar70 = pBStack_4c0;
            do {
              if (((pBVar70->params).size_ != 0) ||
                 ((pBVar70->inherited == true && (pBVar70->leafParamCount != 0)))) {
                if (WVar50 == (WirePointer)local_838.data) {
                  sVar73 = (long)WVar50 - (long)local_838.segment >> 2;
                  if (WVar50 == (WirePointer)local_838.segment) {
                    sVar73 = 4;
                  }
                  kj::Vector<capnp::compiler::BrandScope_*>::setCapacity
                            ((Vector<capnp::compiler::BrandScope_*> *)&local_838,sVar73);
                  WVar50 = (WirePointer)local_838.capTable;
                }
                *(BrandScope **)WVar50 = pBVar70;
                WVar50 = (WirePointer)((long)local_838.capTable + 8);
                local_838.capTable = (CapTableBuilder *)WVar50;
              }
              pBVar70 = (pBVar70->parent).ptr.ptr;
            } while (pBVar70 != (BrandScope *)0x0);
            if (WVar50 != (WirePointer)local_838.segment) {
              local_868._16_8_ = local_328.pointers + 2;
              local_868._0_8_ = local_328.segment;
              local_868._8_8_ = local_328.capTable;
              capnp::_::PointerBuilder::initStruct
                        ((StructBuilder *)&stack0xfffffffffffff758,(PointerBuilder *)local_868,
                         (StructSize)0x10000);
              local_868._4_4_ = in_stack_fffffffffffff75c.upper32Bits;
              local_868._0_4_ = in_stack_fffffffffffff758.value;
              local_868._8_8_ = WStack_8a0;
              local_868._16_8_ = _aStack_890;
              capnp::_::PointerBuilder::initStructList
                        ((ListBuilder *)local_6d8,(PointerBuilder *)local_868,
                         (ElementCount)
                         ((ulong)((long)local_838.capTable - (long)local_838.segment) >> 3),
                         (StructSize)0x10002);
              lVar42 = (long)local_838.capTable - (long)local_838.segment;
              if (lVar42 != 0) {
                uVar65 = lVar42 >> 3;
                uVar86 = 0;
                uVar95 = (undefined2)uVar65;
                iVar97 = (int6)(lVar42 >> 0x13);
                do {
                  capnp::_::ListBuilder::getStructElement
                            ((StructBuilder *)&stack0xfffffffffffff758,(ListBuilder *)local_6d8,
                             (ElementCount)uVar86);
                  uVar82 = uVar86 & 0xffffffff;
                  lVar42 = *(long *)((long)local_838.segment + uVar82 * 8);
                  *(WirePointer *)local_898 = *(WirePointer *)(lVar42 + 0x28);
                  if (*(char *)(lVar42 + 0x34) == '\x01') {
                    *(undefined2 *)&(((WirePointer *)((long)local_898 + 8))->offsetAndKind).value =
                         1;
                  }
                  else {
                    EVar87 = *(ElementCount *)(lVar42 + 0x40);
                    *(undefined2 *)&(((WirePointer *)((long)local_898 + 8))->offsetAndKind).value =
                         0;
                    local_808.segment._4_4_ = in_stack_fffffffffffff75c.upper32Bits;
                    local_808.segment._0_4_ = in_stack_fffffffffffff758.value;
                    local_808.capTable = (CapTableBuilder *)WStack_8a0;
                    local_808.data = (void *)_aStack_890;
                    capnp::_::PointerBuilder::initStructList
                              ((ListBuilder *)local_868,(PointerBuilder *)&local_808,EVar87,
                               (StructSize)0x10001);
                    uVar65 = local_868._24_8_ & 0xffffffff;
                    if (uVar65 != 0) {
                      lVar42 = 0;
                      uVar88 = 0;
                      do {
                        lVar6 = *(long *)(*(long *)((long)local_838.segment + uVar82 * 8) + 0x38);
                        pEVar68 = pBVar69->errorReporter;
                        capnp::_::ListBuilder::getStructElement
                                  (&local_808,(ListBuilder *)local_868,(ElementCount)uVar88);
                        *(undefined2 *)local_808.data = 1;
                        local_768._0_8_ = local_808.segment;
                        local_768._8_8_ = local_808.capTable;
                        local_768._16_8_ = local_808.pointers;
                        capnp::_::PointerBuilder::initStruct
                                  ((StructBuilder *)local_7a8,(PointerBuilder *)local_768,
                                   (StructSize)0x10003);
                        target_01._builder.pointers._4_4_ = BStack_78c;
                        target_01._builder.pointers._0_4_ = aStack_790.upper32Bits;
                        target_01._builder.capTable = (CapTableBuilder *)WStack_7a0;
                        target_01._builder.segment = (SegmentBuilder *)local_7a8;
                        target_01._builder.data = (void *)local_798;
                        target_01._builder.dataSize = local_788;
                        target_01._builder.pointerCount = SStack_784;
                        target_01._builder._38_1_ = EStack_782;
                        target_01._builder._39_1_ = uStack_781;
                        BrandedDecl::compileAsType
                                  ((BrandedDecl *)(lVar6 + lVar42),pEVar68,target_01);
                        uVar88 = uVar88 + 1;
                        lVar42 = lVar42 + 0xa8;
                      } while (uVar65 != uVar88);
                    }
                    uVar65 = CONCAT62(iVar97,uVar95);
                  }
                  uVar86 = uVar86 + 1;
                } while (uVar86 != uVar65);
              }
            }
            pvVar15 = local_838.data;
            pSVar48 = local_838.segment;
            if ((WirePointer)local_838.segment != (WirePointer)0x0) {
              local_838.segment = (SegmentBuilder *)0x0;
              local_838.capTable = (CapTableBuilder *)0x0;
              local_838.data = (void *)0x0;
              WVar77 = (WirePointer)((long)pvVar15 - (long)pSVar48 >> 3);
              (**(code **)*local_838.pointers)(local_838.pointers,pSVar48,8);
            }
            WVar67.field_1.upper32Bits = local_528._4_4_;
            WVar67.offsetAndKind.value = local_528._0_4_;
          }
          else {
LAB_0012f153:
            WVar67.offsetAndKind.value = 0;
            WVar67.field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)0x0;
          }
          pBVar69 = pBStack_4c0;
          if ((local_538[0] == '\x01') && (pBStack_4c0 != (BrandScope *)0x0)) {
            pBStack_4c0 = (BrandScope *)0x0;
            (**local_4c8->_vptr_CapTableReader)
                      (local_4c8,
                       (pBVar69->super_Refcounted).super_Disposer._vptr_Disposer[-2] +
                       (long)&(pBVar69->super_Refcounted).super_Disposer._vptr_Disposer);
          }
        }
      }
LAB_0012f18c:
      ((Refcounted *)local_328.data)->refcount = WVar67.offsetAndKind.value;
      *(anon_union_4_5_35ddcec3_for_WirePointer_1 *)&((Refcounted *)local_328.data)->field_0xc =
           WVar67.field_1;
      iVar64 = 0x7fffffff;
      if ((uVar91 < 0x70) || (*(short *)((long)&(local_740->body).field_1 + 4) != 1)) {
        bVar89 = true;
        uVar71 = 0;
        uVar78 = 0;
        uVar56 = 0x7fffffff;
        psVar84 = (short *)0x0;
        WVar63.offsetAndKind.value = 0;
        WVar63.field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)0x0;
        WVar80.value = 0;
        aVar98.upper32Bits = 0;
      }
      else {
        if ((ushort)local_7d0 < 7) {
          auStack_6d0._16_4_ = 0x7fffffff;
          p_Var55 = (_Base_ptr)0x0;
          pp_Var43 = (_Base_ptr *)0x0;
          pMVar74 = (MemberInfo *)0x0;
        }
        else {
          pp_Var43 = &p_Var100[1]._M_left;
          p_Var55 = p_Var62;
          pMVar74 = local_7e0;
          auStack_6d0._16_4_ = local_7d8._0_4_;
        }
        local_6d8[0] = SUB81(pMVar74,0);
        local_6d8[1] = (undefined1)((ulong)pMVar74 >> 8);
        local_6d8._2_2_ = (undefined2)((ulong)pMVar74 >> 0x10);
        uStack_6d4 = (uint)((ulong)pMVar74 >> 0x20);
        auStack_6d0._0_4_ = SUB84(p_Var55,0);
        auStack_6d0._4_4_ = (undefined4)((ulong)p_Var55 >> 0x20);
        auStack_6d0._8_4_ = SUB84(pp_Var43,0);
        auStack_6d0._12_4_ = (undefined4)((ulong)pp_Var43 >> 0x20);
        capnp::_::PointerReader::getStruct
                  ((StructReader *)local_538,(PointerReader *)local_6d8,(word *)0x0);
        WVar80.value = local_538._0_4_;
        aVar98.upper32Bits = local_538._4_4_;
        WVar63.field_1.upper32Bits = uStack_530._4_4_;
        WVar63.offsetAndKind.value = uStack_530._0_4_;
        psVar84 = (short *)CONCAT44(local_528._4_4_,local_528._0_4_);
        uVar78 = CONCAT44(local_528._12_4_,local_528._8_4_);
        bVar89 = local_528._20_2_ == 0;
        uVar71 = local_528._16_4_;
        uVar56 = local_528._24_4_;
      }
      uVar95 = (undefined2)uVar78;
      iVar97 = (int6)((ulong)uVar78 >> 0x10);
      local_740 = (BrandedDecl *)CONCAT44(local_740._4_4_,uVar56);
      if ((ushort)local_7d0 == 0) {
        p_Var55 = (_Base_ptr)0x0;
        p_Var59 = (_Base_ptr)0x0;
        local_538 = (undefined1  [8])0x0;
      }
      else {
        p_Var55 = p_Var62;
        p_Var59 = p_Var100;
        local_538 = (undefined1  [8])local_7e0;
        iVar64 = (int)local_7d8._0_4_;
      }
      uStack_530._0_4_ = SUB84(p_Var55,0);
      uStack_530._4_4_ = SUB84((ulong)p_Var55 >> 0x20,0);
      local_528._0_4_ = SUB84(p_Var59,0);
      local_528._4_4_ = (undefined4)((ulong)p_Var59 >> 0x20);
      local_528._8_4_ = iVar64;
      capnp::_::PointerReader::getStruct
                ((StructReader *)local_1e8,(PointerReader *)local_538,(word *)0x0);
      local_528._8_4_ = local_1c0;
      pWVar51 = local_1d0;
      if (local_1c4 == 0) {
        pWVar51 = (WirePointer *)0x0;
        local_528._8_4_ = 0x7fffffff;
      }
      local_538._0_4_ = 0;
      local_538._4_4_ = 0;
      uStack_530._0_4_ = 0;
      uStack_530._4_4_ = 0;
      if (local_1c4 != 0) {
        local_538._0_4_ = local_1e8._0_4_;
        local_538._4_4_ = local_1e8._4_4_;
        uStack_530._0_4_ = (anon_union_4_5_35ddcec3_for_WirePointer_1)local_1e8._8_4_;
        uStack_530._4_4_ = aStack_1dc;
      }
      local_528._0_4_ = SUB84(pWVar51,0);
      local_528._4_4_ = (undefined4)((ulong)pWVar51 >> 0x20);
      RVar92 = capnp::_::PointerReader::getBlob<capnp::Text>
                         ((PointerReader *)local_538,(void *)0x0,0);
      local_5a8 = local_578;
      SStack_5a4 = SStack_574;
      EStack_5a2 = EStack_572;
      uStack_5a1 = uStack_571;
      iStack_5a0 = iStack_570;
      uStack_59c = uStack_56c;
      local_5b8.upper32Bits = local_598._16_4_;
      aStack_5b4.upper32Bits = local_598._20_4_;
      uStack_5b0 = local_598._24_4_;
      aStack_5ac.upper32Bits = uStack_57c;
      local_5c8.upper32Bits = local_598._0_4_;
      aStack_5c4.upper32Bits = local_598._4_4_;
      WStack_5c0.value = local_598._8_4_;
      aStack_5bc.upper32Bits = local_598._12_4_;
      if ((uint)uVar71 < 0x10) {
LAB_0012f3b1:
        capnp::_::OrphanBuilder::initStruct
                  ((OrphanBuilder *)local_538,(this->orphanage).arena,(this->orphanage).capTable,
                   (StructSize)0x60006);
        local_718.segment = (SegmentBuilder *)CONCAT44(uStack_530._4_4_,uStack_530._0_4_);
        local_718.capTable = (CapTableBuilder *)CONCAT44(local_528._4_4_,local_528._0_4_);
        local_718.location = (word *)CONCAT44(local_528._12_4_,local_528._8_4_);
        local_718.tag.content = (uint64_t)local_538;
        pAVar60 = (ArrayPtr<const_char> *)0x20002;
        capnp::_::OrphanBuilder::initStruct
                  ((OrphanBuilder *)local_538,(this->orphanage).arena,(this->orphanage).capTable,
                   (StructSize)0x20002);
        local_738.segment = (SegmentBuilder *)CONCAT44(uStack_530._4_4_,uStack_530._0_4_);
        local_738.capTable = (CapTableBuilder *)CONCAT44(local_528._4_4_,local_528._0_4_);
        local_738.location = (word *)CONCAT44(local_528._12_4_,local_528._8_4_);
        local_738.tag.content = (uint64_t)local_538;
        capnp::_::OrphanBuilder::asStruct((StructBuilder *)local_768,&local_718,(StructSize)0x60006)
        ;
        capnp::_::OrphanBuilder::asStructReader
                  ((StructReader *)&stack0xfffffffffffff758,local_2a8,(StructSize)0x60006);
        uStack_530 = (CapTableReader *)(RVar92.super_StringPtr.content.size_ - 1);
        local_6d8[0] = true;
        local_6d8[1] = 0x15;
        local_6d8._2_2_ = 0x1c;
        uStack_6d4 = 0;
        auStack_6d0._0_4_ = 8;
        auStack_6d0._4_4_ = 0;
        local_538 = (undefined1  [8])RVar92.super_StringPtr.content.ptr;
        kj::_::concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
                  (&local_5f8,(_ *)local_538,(ArrayPtr<const_char> *)local_6d8,pAVar60);
        if (local_888 < 0x40) {
          parentId_00.offsetAndKind.value = 0;
          parentId_00.field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)0x0;
        }
        else {
          parentId_00 = *(WirePointer *)local_898;
        }
        WVar45 = (WirePointer)generateMethodParamsId((uint64_t)parentId_00,(uint16_t)local_390,true)
        ;
        *(WirePointer *)local_768._16_8_ = WVar45;
        bVar90 = SStack_884 == 0;
        WVar52 = _aStack_890;
        if (bVar90) {
          WVar52.offsetAndKind.value = 0;
          WVar52.field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)0x0;
        }
        local_528._8_4_ = iStack_880;
        if (bVar90) {
          local_528._8_4_ = 0x7fffffff;
        }
        local_538._0_4_ = 0;
        local_538._4_4_ = 0;
        uStack_530._0_4_ = (anon_union_4_5_35ddcec3_for_WirePointer_1)0;
        uStack_530._4_4_ = 0;
        if (!bVar90) {
          local_538._0_4_ = in_stack_fffffffffffff758.value;
          local_538._4_4_ = in_stack_fffffffffffff75c;
          uStack_530._0_4_ =
               (anon_union_4_5_35ddcec3_for_WirePointer_1)WStack_8a0.offsetAndKind.value;
          uStack_530._4_4_ = WStack_8a0.field_1.upper32Bits;
        }
        local_528._0_4_ = WVar52.offsetAndKind.value;
        local_528._4_4_ = WVar52.field_1;
        RVar92 = capnp::_::PointerReader::getBlob<capnp::Text>
                           ((PointerReader *)local_538,(void *)0x0,0);
        local_538 = RVar92.super_StringPtr.content.ptr;
        uStack_530 = (CapTableReader *)(RVar92.super_StringPtr.content.size_ - 1);
        local_868[0] = 0x2e;
        local_568.segment = (SegmentReader *)local_5f8.content.size_;
        if ((WirePointer)local_5f8.content.size_ != (WirePointer)0x0) {
          local_568.segment = (SegmentReader *)local_5f8.content.ptr;
        }
        local_568.capTable._0_4_ = 0;
        local_568.capTable._4_4_ = (anon_union_4_5_35ddcec3_for_WirePointer_1)0x0;
        if ((WirePointer)local_5f8.content.size_ != (WirePointer)0x0) {
          local_568.capTable = (CapTableReader *)(local_5f8.content.size_ + -1);
        }
        kj::_::concat<kj::ArrayPtr<char_const>,kj::FixedArray<char,1ul>,kj::ArrayPtr<char_const>>
                  ((String *)local_6d8,(_ *)local_538,(ArrayPtr<const_char> *)local_868,
                   (FixedArray<char,_1UL> *)&local_568,(ArrayPtr<const_char> *)WVar77);
        lVar42 = CONCAT44(auStack_6d0._4_4_,auStack_6d0._0_4_);
        pcVar75 = "";
        if (lVar42 != 0) {
          pcVar75 = (char *)CONCAT44(uStack_6d4,
                                     CONCAT22(local_6d8._2_2_,CONCAT11(local_6d8[1],local_6d8[0])));
        }
        value.super_StringPtr.content.size_ = lVar42 + (ulong)(lVar42 == 0);
        local_538 = (undefined1  [8])local_768._0_8_;
        uStack_530._0_4_ = SUB84(local_768._8_8_,0);
        uStack_530._4_4_ = SUB84(local_768._8_8_,4);
        local_528._0_4_ = (undefined4)local_768._24_8_;
        local_528._4_4_ = SUB84(local_768._24_8_,4);
        value.super_StringPtr.content.ptr = pcVar75;
        capnp::_::PointerBuilder::setBlob<capnp::Text>((PointerBuilder *)local_538,value);
        lVar42 = CONCAT44(uStack_6d4,CONCAT22(local_6d8._2_2_,CONCAT11(local_6d8[1],local_6d8[0])));
        if (lVar42 != 0) {
          local_6d8[0] = false;
          local_6d8[1] = 0;
          local_6d8._2_2_ = 0;
          uStack_6d4 = 0;
          auStack_6d0._0_4_ = 0;
          auStack_6d0._4_4_ = 0;
          (*(code *)**(undefined8 **)CONCAT44(auStack_6d0._12_4_,auStack_6d0._8_4_))
                    ((undefined8 *)CONCAT44(auStack_6d0._12_4_,auStack_6d0._8_4_),lVar42,1);
        }
        local_538 = (undefined1  [8])local_768._0_8_;
        uStack_530._0_4_ = SUB84(local_768._8_8_,0);
        uStack_530._4_4_ = SUB84(local_768._8_8_,4);
        local_528._0_4_ = (undefined4)local_768._24_8_;
        local_528._4_4_ = SUB84(local_768._24_8_,4);
        capnp::_::PointerBuilder::getBlob<capnp::Text>
                  ((Builder *)local_6d8,(PointerBuilder *)local_538,(void *)0x0,0);
        uVar91 = 0;
        if ((WirePointer)local_5f8.content.size_ != (WirePointer)0x0) {
          uVar91 = (uint)local_5f8.content.size_ - 1;
        }
        (((WirePointer *)(local_768._16_8_ + 8))->offsetAndKind).value = ~uVar91 + auStack_6d0._8_4_
        ;
        if ((local_888 < 0x121) || (bVar90 = true, (*(byte *)((long)local_898 + 0x24) & 1) == 0)) {
          bVar90 = uStack_5b0 != 0;
        }
        *(byte *)(local_768._16_8_ + 0x24) = *(byte *)(local_768._16_8_ + 0x24) & 0xfe | bVar90;
        ((WirePointer *)(local_768._16_8_ + 0x10))->offsetAndKind = 0;
        ((WirePointer *)(local_768._16_8_ + 0x10))->field_1 =
             (anon_union_4_5_35ddcec3_for_WirePointer_1)0x0;
        if ((uint)uVar71 < 0x40) {
          (((WirePointer *)(local_768._16_8_ + 0x28))->offsetAndKind).value = 0;
LAB_0012f6fc:
          uVar58 = 0;
          bVar90 = true;
        }
        else {
          (((WirePointer *)(local_768._16_8_ + 0x28))->offsetAndKind).value = *(uint *)(psVar84 + 2)
          ;
          if ((uint)uVar71 < 0x60) goto LAB_0012f6fc;
          uVar58 = *(uint32_t *)(psVar84 + 4);
          bVar90 = false;
        }
        ((anon_union_4_5_35ddcec3_for_WirePointer_1 *)(local_768._16_8_ + 0x2c))->upper32Bits =
             uVar58;
        ((anon_union_4_5_35ddcec3_for_WirePointer_1 *)(local_768._16_8_ + 0xc))->upper32Bits = 1;
        (((WirePointer *)(local_768._16_8_ + 0x18))->offsetAndKind).value = 0;
        *(byte *)(local_768._16_8_ + 0x1c) = *(byte *)(local_768._16_8_ + 0x1c) & 0xfe;
        *(undefined2 *)(local_768._16_8_ + 0x1e) = 0;
        (((WirePointer *)(local_768._16_8_ + 0x20))->offsetAndKind).value = 0;
        local_528._0_8_ = local_768._24_8_ + 0x18;
        local_538 = (undefined1  [8])local_768._0_8_;
        uStack_530._0_4_ = SUB84(local_768._8_8_,0);
        uStack_530._4_4_ = SUB84(local_768._8_8_,4);
        capnp::_::PointerBuilder::clear((PointerBuilder *)local_538);
        capnp::_::OrphanBuilder::asStruct((StructBuilder *)local_538,&local_738,(StructSize)0x20002)
        ;
        uVar58 = 0;
        *(WirePointer *)local_528._0_8_ = *(WirePointer *)local_768._16_8_;
        uVar91 = 0;
        if (0x3f < (uint)uVar71) {
          uVar91 = *(uint *)(psVar84 + 2);
        }
        (((WirePointer *)(local_528._0_8_ + 8))->offsetAndKind).value = uVar91;
        if (!bVar90) {
          uVar58 = *(uint32_t *)(psVar84 + 4);
        }
        ((anon_union_4_5_35ddcec3_for_WirePointer_1 *)(local_528._0_8_ + 0xc))->upper32Bits = uVar58
        ;
        auStack_6d0._48_8_ = CONCAT44(_SStack_5a4,local_5a8);
        auStack_6d0._60_4_ = uStack_59c;
        auStack_6d0._56_4_ = iStack_5a0;
        auStack_6d0._32_4_ = local_5b8;
        auStack_6d0._36_4_ = aStack_5b4;
        auStack_6d0._40_4_ = uStack_5b0;
        auStack_6d0._44_4_ = aStack_5ac;
        auStack_6d0._16_4_ = local_5c8;
        auStack_6d0._20_4_ = aStack_5c4;
        auStack_6d0._24_4_ = WStack_5c0.value;
        auStack_6d0._28_4_ = aStack_5bc;
        auStack_6d0._0_4_ = SUB84(this->errorReporter,0);
        auStack_6d0._4_4_ = (undefined4)((ulong)this->errorReporter >> 0x20);
        auStack_6d0._8_4_ = (*(WirePointer *)local_768._16_8_).offsetAndKind;
        auStack_6d0._12_4_ = (*(WirePointer *)local_768._16_8_).field_1;
        aSStack_690[0]._vptr_StructOrGroup = (_func_int **)&PTR_addVoid_0020ea00;
        aSStack_690[3]._vptr_StructOrGroup = (_func_int **)0x0;
        aSStack_690[4]._vptr_StructOrGroup = (_func_int **)0x0;
        aSStack_690[1]._vptr_StructOrGroup = (_func_int **)0x0;
        aSStack_690[2]._vptr_StructOrGroup = (_func_int **)0x0;
        local_6d8[0] = bVar24;
        local_6d8[1] = uVar26;
        local_6d8._2_2_ = uVar27;
        uStack_6d4 = uVar28;
        kj::Arena::Arena((Arena *)local_668,0x400);
        psVar35 = local_2b8;
        local_648._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        local_648._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_648._M_impl.super__Rb_tree_header._M_header._M_left = local_2b0;
        local_648._M_impl.super__Rb_tree_header._M_header._M_right = local_2b0;
        local_2b8[2] = 0;
        psVar35[3] = 0;
        *psVar35 = 0;
        psVar35[1] = 0;
        local_600 = (ArrayDisposer *)&kj::NullArrayDisposer::instance;
        uVar78 = CONCAT62(iVar97,uVar95);
        local_538 = (undefined1  [8])CONCAT44(aVar98.upper32Bits,WVar80.value);
        if (bVar89) {
          WVar63.offsetAndKind.value = 0;
          WVar63.field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)0x0;
          uVar78 = 0;
          local_538 = (undefined1  [8])0x0;
          local_528._8_4_ = 0x7fffffff;
        }
        else {
          local_528._8_4_ = (uint)local_740;
        }
        uStack_530._0_4_ = (uint32_t)WVar63.offsetAndKind.value;
        uStack_530._4_4_ = WVar63.field_1;
        local_528._0_4_ = (undefined4)uVar78;
        local_528._4_4_ = (undefined4)((ulong)uVar78 >> 0x20);
        capnp::_::PointerReader::getList
                  (&local_568,(PointerReader *)local_538,INLINE_COMPOSITE,(word *)0x0);
        local_268.offsetAndKind.value = local_768._0_4_;
        local_268.field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)local_768._4_4_;
        WStack_260.offsetAndKind.value = local_768._8_4_;
        WStack_260.field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)local_768._12_4_;
        local_258.offsetAndKind.value = local_768._16_4_;
        local_258.field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)local_768._20_4_;
        WStack_250.offsetAndKind.value = local_768._24_4_;
        WStack_250.field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)local_768._28_4_;
        local_248.offsetAndKind.value = local_768._32_4_;
        local_248.field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)local_768._36_4_;
        capnp::_::OrphanBuilder::asStruct(&local_180,&local_738,(StructSize)0x20002);
        puVar34 = local_2c0;
        local_2c0[4] = local_180._32_8_;
        pWVar51 = local_180.pointers;
        pCVar14 = local_180.capTable;
        pSVar48 = local_180.segment;
        puVar34[2] = local_180.data;
        puVar34[3] = pWVar51;
        *puVar34 = pSVar48;
        puVar34[1] = pCVar14;
        WVar67 = WStack_250;
        WVar83 = local_258;
        WVar45 = WStack_260;
        WVar77 = local_268;
        pWVar51 = local_2c8;
        local_868._0_4_ = local_268.offsetAndKind.value;
        local_868._4_4_ = local_268.field_1;
        local_868._8_4_ = WStack_260.offsetAndKind.value;
        local_868._12_4_ = WStack_260.field_1;
        local_868._16_4_ = local_258.offsetAndKind.value;
        local_868._20_4_ = local_258.field_1;
        local_868._24_4_ = WStack_250.offsetAndKind.value;
        local_868._28_4_ = WStack_250.field_1;
        local_848 = local_248;
        local_2c8[4] = local_248;
        pWVar51[2] = WVar83;
        pWVar51[3] = WVar67;
        *pWVar51 = WVar77;
        pWVar51[1] = WVar45;
        puVar34 = local_2d0;
        local_538 = (undefined1  [8])0x0;
        uStack_530._0_4_ = (anon_union_4_5_35ddcec3_for_WirePointer_1)0x0;
        uStack_530._4_4_ = (anon_union_4_5_35ddcec3_for_WirePointer_1)0x0;
        local_528._0_4_ = 0;
        local_528._4_4_ = 0;
        local_528._8_4_ = 0;
        local_528._12_4_ = local_528._12_4_ & 0xffffff00;
        local_528._16_4_ = 0x1d857d;
        local_528._20_2_ = 0;
        local_528._22_2_ = 0;
        local_528._24_4_ = 1;
        local_528._28_4_ = 0;
        local_528._64_6_ = 0;
        local_528._48_8_ = 0;
        local_528._56_6_ = 0;
        local_528._62_2_ = 0;
        local_528._32_4_ = 0;
        local_528._36_4_ = 0;
        local_528._40_4_ = 0;
        local_528._44_4_ = 0;
        local_528._72_4_ = 0x7fffffff;
        local_528._82_2_ = 0;
        local_4b8._8_4_ = 0;
        local_4b8._12_2_ = 0;
        pBStack_4c0 = (BrandScope *)0x0;
        local_4b8._0_6_ = 0;
        local_4b8._6_2_ = 0;
        local_528._88_8_ = 0;
        local_4c8 = (CapTableReader *)0x0;
        local_4b8._16_4_ = 0x7fffffff;
        *(undefined8 *)((long)local_2d0 + 0x1e) = 0;
        puVar34[2] = 0;
        puVar34[3] = 0;
        *puVar34 = 0;
        puVar34[1] = 0;
        puVar34 = local_2d8;
        local_4b8._64_4_ = 0x7fffffff;
        *(undefined8 *)((long)local_2d8 + 0x1e) = 0;
        puVar34[2] = 0;
        puVar34[3] = 0;
        *puVar34 = 0;
        puVar34[1] = 0;
        puVar34 = local_2e0;
        local_4b8[0x6e] = INLINE_COMPOSITE;
        local_4b8._112_4_ = 0x7fffffff;
        local_4b8[0x98] = false;
        *(undefined1 *)(local_2e0 + 1) = 0;
        *puVar34 = 0;
        local_3a0.fieldScope = (StructOrGroup *)0x0;
        params_01.reader.step = local_568.step;
        params_01.reader.elementCount = local_568.elementCount;
        params_01.reader.capTable = local_568.capTable;
        params_01.reader.segment = local_568.segment;
        params_01.reader.ptr = local_568.ptr;
        params_01.reader.structDataSize = local_568.structDataSize;
        params_01.reader.structPointerCount = local_568.structPointerCount;
        params_01.reader.elementSize = local_568.elementSize;
        params_01.reader._39_1_ = local_568._39_1_;
        params_01.reader.nestingLimit = local_568.nestingLimit;
        params_01.reader._44_4_ = local_568._44_4_;
        StructTranslator::traverseParams
                  ((StructTranslator *)local_6d8,params_01,(MemberInfo *)local_538,aSStack_690);
        builder_01._builder.capTable = (CapTableBuilder *)local_868._8_8_;
        builder_01._builder.segment = (SegmentBuilder *)local_868._0_8_;
        builder_01._builder.data = (void *)local_868._16_8_;
        builder_01._builder.pointers = (WirePointer *)local_868._24_8_;
        builder_01._builder._32_8_ = local_848;
        StructTranslator::translateInternal
                  ((StructTranslator *)local_6d8,(MemberInfo *)local_538,builder_01);
        pppMVar33 = local_2e8;
        ppMVar30 = local_610;
        ppMVar29 = ppMStack_618;
        if (ppMStack_618 != (MemberInfo **)0x0) {
          *local_2e8 = (MemberInfo **)0x0;
          pppMVar33[1] = (MemberInfo **)0x0;
          pppMVar33[2] = (MemberInfo **)0x0;
          (*(code *)**(undefined8 **)local_600)
                    (local_600,ppMVar29,8,(long)ppMVar30 - (long)ppMVar29 >> 3);
        }
        std::
        _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_capnp::compiler::NodeTranslator::StructTranslator::MemberInfo_*>,_std::_Select1st<std::pair<const_unsigned_int,_capnp::compiler::NodeTranslator::StructTranslator::MemberInfo_*>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_capnp::compiler::NodeTranslator::StructTranslator::MemberInfo_*>_>_>
        ::~_Rb_tree(local_398);
        kj::Arena::~Arena((Arena *)local_668);
        pwVar23 = local_718.location;
        pCVar22 = local_718.capTable;
        pSVar76 = local_718.segment;
        wVar21.content = local_718.tag.content;
        pwVar20 = local_738.location;
        pCVar14 = local_738.capTable;
        pSVar48 = local_738.segment;
        wVar19.content = local_738.tag.content;
        WVar80 = (*(WirePointer *)local_768._16_8_).offsetAndKind;
        aVar98 = (*(WirePointer *)local_768._16_8_).field_1;
        uStack_530._0_4_ = SUB84(local_718.segment,0);
        uStack_530._4_4_ = SUB84((ulong)local_718.segment >> 0x20,0);
        local_528._0_4_ = SUB84(local_718.capTable,0);
        local_528._4_4_ = (undefined4)((ulong)local_718.capTable >> 0x20);
        local_528._8_4_ = SUB84(local_718.location,0);
        local_528._12_4_ = (undefined4)((ulong)local_718.location >> 0x20);
        local_538 = (undefined1  [8])local_718.tag.content;
        local_718.segment = (SegmentBuilder *)0x0;
        local_718.location = (word *)0x0;
        local_528._24_4_ = SUB84(local_738.segment,0);
        local_528._28_4_ = (undefined4)((ulong)local_738.segment >> 0x20);
        local_528._32_4_ = SUB84(local_738.capTable,0);
        local_528._36_4_ = (undefined4)((ulong)local_738.capTable >> 0x20);
        local_528._40_4_ = SUB84(local_738.location,0);
        local_528._44_4_ = (undefined4)((ulong)local_738.location >> 0x20);
        local_528._16_4_ = (undefined4)local_738.tag.content;
        local_528._20_2_ = (undefined2)(local_738.tag.content >> 0x20);
        local_528._22_2_ = (undefined2)(local_738.tag.content >> 0x30);
        local_738.segment = (SegmentBuilder *)0x0;
        local_738.location = (word *)0x0;
        pRVar53 = (this->paramStructs).builder.pos;
        if (pRVar53 == (this->paramStructs).builder.endPtr) {
          sVar73 = (long)pRVar53 -
                   (long)*(RemoveConst<capnp::compiler::NodeTranslator::AuxNode> **)local_2f0 >> 5;
          if (pRVar53 == *(RemoveConst<capnp::compiler::NodeTranslator::AuxNode> **)local_2f0) {
            sVar73 = 4;
          }
          kj::Vector<capnp::compiler::NodeTranslator::AuxNode>::setCapacity
                    ((Vector<capnp::compiler::NodeTranslator::AuxNode> *)local_2f0,sVar73);
          pRVar53 = (this->paramStructs).builder.pos;
        }
        (pRVar53->node).builder.segment = pSVar76;
        (pRVar53->node).builder.capTable = pCVar22;
        (pRVar53->node).builder.location = pwVar23;
        (pRVar53->node).builder.tag.content = wVar21.content;
        (pRVar53->sourceInfo).builder.segment = pSVar48;
        (pRVar53->sourceInfo).builder.capTable = pCVar14;
        (pRVar53->sourceInfo).builder.location = pwVar20;
        (pRVar53->sourceInfo).builder.tag.content = wVar19.content;
        ppRVar1 = &(this->paramStructs).builder.pos;
        *ppRVar1 = *ppRVar1 + 1;
        BrandScope::push((BrandScope *)local_778,(uint64_t)(this->localBrand).ptr,
                         (*(WirePointer *)local_768._16_8_).offsetAndKind.value);
        uVar65 = (ulong)uStack_5b0;
        if (uVar65 != 0) {
          pSVar48 = (SegmentBuilder *)
                    kj::_::HeapArrayDisposer::allocateImpl
                              (0xa8,0,uVar65,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
          local_808.data = pSVar48 + uVar65 * 3;
          local_808.pointers = (WirePointer *)&kj::_::HeapArrayDisposer::instance;
          local_528._0_8_ = local_768._24_8_ + 0x28;
          local_538 = (undefined1  [8])local_768._0_8_;
          uStack_530._0_4_ = SUB84(local_768._8_8_,0);
          uStack_530._4_4_ = SUB84(local_768._8_8_,4);
          local_808.segment = pSVar48;
          local_808.capTable = (CapTableBuilder *)pSVar48;
          capnp::_::PointerBuilder::initStructList
                    ((ListBuilder *)local_6d8,(PointerBuilder *)local_538,uStack_5b0,
                     (StructSize)0x10000);
          uVar65 = (ulong)uStack_5b0;
          WVar77 = (WirePointer)&kj::_::HeapArrayDisposer::instance;
          pSVar76 = pSVar48;
          if (uVar65 != 0) {
            uVar86 = 0;
            do {
              EVar87 = (ElementCount)uVar86;
              capnp::_::ListReader::getStructElement
                        ((StructReader *)local_538,(ListReader *)&local_5c8.structRef,EVar87);
              *(undefined4 *)&((SegmentReader *)&(local_808.capTable)->super_CapTableReader)->arena
                   = 2;
              *(undefined8 *)&((SegmentReader *)&(local_808.capTable)->super_CapTableReader)->id = 0
              ;
              *(ElementCount *)
               &(((SegmentReader *)&(local_808.capTable)->super_CapTableReader)->ptr).ptr = EVar87;
              *(undefined8 *)&((SegmentBuilder *)((long)local_808.capTable + 0x38))->readOnly = 0;
              (((SegmentBuilder *)((long)local_808.capTable + 0x70))->super_SegmentReader).arena =
                   (Arena *)0x0;
              *(undefined8 *)
               &(((SegmentBuilder *)((long)local_808.capTable + 0x70))->super_SegmentReader).id = 0;
              (((SegmentBuilder *)((long)local_808.capTable + 0x70))->super_SegmentReader).ptr.ptr =
                   (word *)0x0;
              (((SegmentBuilder *)((long)local_808.capTable + 0x70))->super_SegmentReader).ptr.size_
                   = 0;
              (((SegmentBuilder *)((long)local_808.capTable + 0x70))->super_SegmentReader).
              readLimiter = (ReadLimiter *)0x0;
              ((SegmentBuilder *)((long)local_808.capTable + 0x70))->pos = (word *)0x0;
              *(undefined8 *)&((SegmentBuilder *)((long)local_808.capTable + 0x70))->readOnly =
                   0x7fffffff;
              local_808.capTable = (CapTableBuilder *)((long)local_808.capTable + 0xa8);
              capnp::_::ListBuilder::getStructElement
                        ((StructBuilder *)local_868,(ListBuilder *)local_6d8,EVar87);
              aStack_790 = (anon_union_4_5_35ddcec3_for_WirePointer_1)local_528._24_4_;
              local_798 = (WirePointer)CONCAT44(local_528._12_4_,local_528._8_4_);
              if (local_528._20_2_ == 0) {
                aStack_790.upper32Bits = 0x7fffffff;
                local_798 = (WirePointer)(WirePointer *)0x0;
              }
              local_7a8._0_4_ = 0;
              local_7a8._4_4_ = 0;
              WStack_7a0.offsetAndKind.value = 0;
              WStack_7a0.field_1.upper32Bits = 0;
              if (local_528._20_2_ != 0) {
                local_7a8._0_4_ = local_538._0_4_;
                local_7a8._4_4_ = local_538._4_4_;
                WStack_7a0.offsetAndKind.value = (uint)uStack_530._0_4_;
                WStack_7a0.field_1 = uStack_530._4_4_;
              }
              RVar92 = capnp::_::PointerReader::getBlob<capnp::Text>
                                 ((PointerReader *)local_7a8,(void *)0x0,0);
              local_7a8 = (undefined1  [8])local_868._0_8_;
              WStack_7a0.offsetAndKind.value = local_868._8_4_;
              WStack_7a0.field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)local_868._12_4_;
              local_798.offsetAndKind.value = local_868._24_4_;
              local_798.field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)local_868._28_4_;
              capnp::_::PointerBuilder::setBlob<capnp::Text>((PointerBuilder *)local_7a8,RVar92);
              uVar86 = uVar86 + 1;
              WVar77 = (WirePointer)local_808.pointers;
              pSVar48 = local_808.segment;
              pSVar76 = (SegmentBuilder *)local_808.capTable;
            } while (uVar65 != uVar86);
          }
          WStack_6f0 = (WirePointer)(((long)pSVar76 - (long)pSVar48 >> 3) * -0x30c30c30c30c30c3);
          local_808.segment = (SegmentBuilder *)0x0;
          local_808.capTable = (CapTableBuilder *)0x0;
          local_808.data = (void *)0x0;
          local_528._16_4_ = 0;
          local_528._20_2_ = 0;
          local_528._22_2_ = 0;
          local_528._28_4_ = 0;
          local_538 = (undefined1  [8])0x0;
          uStack_530._0_4_ = (anon_union_4_5_35ddcec3_for_WirePointer_1)0x0;
          uStack_530._4_4_ = (anon_union_4_5_35ddcec3_for_WirePointer_1)0x0;
          local_528._0_4_ = 0;
          local_528._4_4_ = 0;
          local_528._8_4_ = 0;
          local_528._12_4_ = 0;
          local_528._24_4_ = 0x7fffffff;
          auVar10 = ZEXT1640(ZEXT816(0)) << 0x40;
          source_02._reader._40_8_ = 0x7fffffff;
          source_02._reader.segment = (SegmentReader *)auVar10._0_8_;
          source_02._reader.capTable = (CapTableReader *)auVar10._8_8_;
          source_02._reader.data = (void *)auVar10._16_8_;
          source_02._reader.pointers = (WirePointer *)auVar10._24_8_;
          source_02._reader.dataSize = auVar10._32_4_;
          source_02._reader.pointerCount = auVar10._36_2_;
          source_02._reader._38_2_ = auVar10._38_2_;
          local_6f8 = pSVar48;
          local_6e8 = WVar77;
          BrandScope::setParams
                    ((BrandScope *)local_338,(Array<capnp::compiler::BrandedDecl> *)local_770,
                     (Which)&local_6f8,source_02);
          plVar32 = local_330;
          if (local_330 != (long *)0x0) {
            local_330 = (long *)0x0;
            (**(code **)*(_func_int **)local_338)
                      (local_338,(long)plVar32 + *(long *)(*plVar32 + -0x10));
          }
          WVar77 = WStack_6f0;
          pSVar48 = local_6f8;
          if (local_6f8 != (SegmentBuilder *)0x0) {
            local_6f8 = (SegmentBuilder *)0x0;
            WStack_6f0.offsetAndKind.value = 0;
            WStack_6f0.field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)0x0;
            (**(code **)*(WirePointer *)local_6e8)(local_6e8,pSVar48,0xa8,WVar77,WVar77);
          }
        }
        pBVar70 = local_770;
        local_7c8.builder.ptr = (BrandScope **)0x0;
        local_7c8.builder.pos = (BrandScope **)0x0;
        local_7c8.builder.endPtr = (BrandScope **)0x0;
        local_7c8.builder.disposer = (ArrayDisposer *)&kj::NullArrayDisposer::instance;
        ppBVar49 = (BrandScope **)0x0;
        pBVar69 = local_770;
        do {
          if (((pBVar69->params).size_ != 0) ||
             ((pBVar69->inherited == true && (pBVar69->leafParamCount != 0)))) {
            if (ppBVar49 == local_7c8.builder.endPtr) {
              sVar73 = (long)ppBVar49 - (long)local_7c8.builder.ptr >> 2;
              if (ppBVar49 == local_7c8.builder.ptr) {
                sVar73 = 4;
              }
              kj::Vector<capnp::compiler::BrandScope_*>::setCapacity(&local_7c8,sVar73);
              ppBVar49 = local_7c8.builder.pos;
            }
            *ppBVar49 = pBVar69;
            ppBVar49 = local_7c8.builder.pos + 1;
            local_7c8.builder.pos = ppBVar49;
          }
          pBVar69 = (pBVar69->parent).ptr.ptr;
        } while (pBVar69 != (BrandScope *)0x0);
        if (ppBVar49 != local_7c8.builder.ptr) {
          local_798 = (WirePointer)(local_328.pointers + 3);
          local_7a8 = (undefined1  [8])local_328.segment;
          WStack_7a0 = (WirePointer)local_328.capTable;
          capnp::_::PointerBuilder::initStruct
                    ((StructBuilder *)local_868,(PointerBuilder *)local_7a8,(StructSize)0x10000);
          local_7a8 = (undefined1  [8])local_868._0_8_;
          WStack_7a0.offsetAndKind.value = local_868._8_4_;
          WStack_7a0.field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)local_868._12_4_;
          local_798.offsetAndKind.value = local_868._24_4_;
          local_798.field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)local_868._28_4_;
          capnp::_::PointerBuilder::initStructList
                    ((ListBuilder *)local_6d8,(PointerBuilder *)local_7a8,
                     (ElementCount)
                     ((ulong)((long)local_7c8.builder.pos - (long)local_7c8.builder.ptr) >> 3),
                     (StructSize)0x10002);
          lVar42 = (long)local_7c8.builder.pos - (long)local_7c8.builder.ptr;
          if (lVar42 != 0) {
            uVar65 = lVar42 >> 3;
            uVar86 = 0;
            uVar95 = (undefined2)uVar65;
            iVar97 = (int6)(lVar42 >> 0x13);
            do {
              capnp::_::ListBuilder::getStructElement
                        ((StructBuilder *)local_868,(ListBuilder *)local_6d8,(ElementCount)uVar86);
              uVar82 = uVar86 & 0xffffffff;
              pBVar69 = local_7c8.builder.ptr[uVar82];
              *(uint64_t *)local_868._16_8_ = pBVar69->leafId;
              if (pBVar69->inherited == true) {
                *(undefined2 *)&(((WirePointer *)(local_868._16_8_ + 8))->offsetAndKind).value = 1;
              }
              else {
                sVar73 = (pBVar69->params).size_;
                *(undefined2 *)&(((WirePointer *)(local_868._16_8_ + 8))->offsetAndKind).value = 0;
                local_838.segment = (SegmentBuilder *)local_868._0_8_;
                local_838.capTable = (CapTableBuilder *)local_868._8_8_;
                local_838.data = (void *)local_868._24_8_;
                capnp::_::PointerBuilder::initStructList
                          ((ListBuilder *)local_7a8,(PointerBuilder *)&local_838,
                           (ElementCount)sVar73,(StructSize)0x10001);
                uVar65 = (ulong)aStack_790.upper32Bits;
                if (uVar65 != 0) {
                  lVar42 = 0;
                  uVar88 = 0;
                  do {
                    pBVar4 = (local_7c8.builder.ptr[uVar82]->params).ptr;
                    pAVar5 = (ArrayDisposer *)pBVar70->errorReporter;
                    capnp::_::ListBuilder::getStructElement
                              (&local_838,(ListBuilder *)local_7a8,(ElementCount)uVar88);
                    *(undefined2 *)local_838.data = 1;
                    local_208.segment = local_838.segment;
                    local_208.capTable = local_838.capTable;
                    local_208.pointer = local_838.pointers;
                    capnp::_::PointerBuilder::initStruct(&local_808,&local_208,(StructSize)0x10003);
                    target_02._builder.capTable = local_808.capTable;
                    target_02._builder.segment = local_808.segment;
                    target_02._builder.data = local_808.data;
                    target_02._builder.pointers = local_808.pointers;
                    target_02._builder.dataSize = local_808.dataSize;
                    target_02._builder.pointerCount = local_808.pointerCount;
                    target_02._builder._38_2_ = local_808._38_2_;
                    BrandedDecl::compileAsType
                              ((BrandedDecl *)((long)&(pBVar4->body).tag + lVar42),
                               (ErrorReporter *)pAVar5,target_02);
                    uVar88 = uVar88 + 1;
                    lVar42 = lVar42 + 0xa8;
                  } while (uVar65 != uVar88);
                }
                uVar65 = CONCAT62(iVar97,uVar95);
              }
              uVar86 = uVar86 + 1;
            } while (uVar86 != uVar65);
          }
        }
        ppBVar17 = local_7c8.builder.endPtr;
        ppBVar16 = local_7c8.builder.pos;
        ppBVar49 = local_7c8.builder.ptr;
        if (local_7c8.builder.ptr != (BrandScope **)0x0) {
          local_7c8.builder.ptr = (BrandScope **)0x0;
          local_7c8.builder.pos = (BrandScope **)0x0;
          local_7c8.builder.endPtr = (BrandScope **)0x0;
          (*(code *)**(undefined8 **)local_7c8.builder.disposer)
                    (local_7c8.builder.disposer,ppBVar49,8,(long)ppBVar16 - (long)ppBVar49 >> 3,
                     (long)ppBVar17 - (long)ppBVar49 >> 3);
        }
        pBVar69 = local_770;
        if (local_770 != (BrandScope *)0x0) {
          local_770 = (BrandScope *)0x0;
          (**(code **)*(_func_int **)local_778)
                    (local_778,
                     (long)&(pBVar69->super_Refcounted).super_Disposer._vptr_Disposer +
                     *(long *)&((BrandedDecl *)
                               (pBVar69->super_Refcounted).super_Disposer._vptr_Disposer)[-1].source
                               ._reader.dataSize);
        }
        sVar73 = local_5f8.content.size_;
        pcVar75 = local_5f8.content.ptr;
        if ((WirePointer)local_5f8.content.ptr != (WirePointer)0x0) {
          local_5f8.content.ptr = (char *)0x0;
          local_5f8.content.size_._0_4_ = 0;
          local_5f8.content.size_._4_4_ = (anon_union_4_5_35ddcec3_for_WirePointer_1)0x0;
          (*(code *)**(undefined8 **)local_5f8.content.disposer)
                    (local_5f8.content.disposer,pcVar75,1,sVar73,sVar73);
        }
        pEVar68 = (ErrorReporter *)CONCAT44(aVar98.upper32Bits,WVar80.value);
        if (local_738.segment != (SegmentBuilder *)0x0) {
          capnp::_::OrphanBuilder::euthanize(&local_738);
        }
        if (local_718.segment != (SegmentBuilder *)0x0) {
          capnp::_::OrphanBuilder::euthanize(&local_718);
        }
      }
      else {
        sVar3 = *psVar84;
        if (sVar3 == 2) {
          (*this->resolver->_vptr_Resolver[8])
                    ((MemberInfo *)local_538,this->resolver,"/capnp/stream.capnp",0x14);
          if (local_538[0] == '\x01') {
            (**(code **)(*(long *)CONCAT44(local_528._28_4_,local_528._24_4_) + 8))
                      ((MemberInfo *)local_538,(long *)CONCAT44(local_528._28_4_,local_528._24_4_),
                       "StreamResult");
            pEVar68 = (ErrorReporter *)0x995f9a3377c0b16e;
            if (local_538[0] != '\0') goto LAB_00130c6b;
            pEVar68 = this->errorReporter;
            uVar78 = 0x96;
            uVar65 = 0;
            if (0x3f < (uint)uVar71) {
              uVar91 = *(uint *)(psVar84 + 2);
              pcVar75 = 
              "The version of \'/capnp/stream.capnp\' found in your import path does not appear to be the official one; it is missing the declaration of StreamResult."
              ;
              goto LAB_00130a0f;
            }
            uVar86 = 0;
            pcVar75 = 
            "The version of \'/capnp/stream.capnp\' found in your import path does not appear to be the official one; it is missing the declaration of StreamResult."
            ;
          }
          else {
            pEVar68 = this->errorReporter;
            uVar78 = 0xb7;
            uVar65 = 0;
            if ((uint)uVar71 < 0x40) {
              uVar86 = 0;
              pcVar75 = 
              "A method declaration uses streaming, but \'/capnp/stream.capnp\' is not found in the import path. This is a standard file that should always be installed with the Cap\'n Proto compiler."
              ;
            }
            else {
              uVar91 = *(uint *)(psVar84 + 2);
              pcVar75 = 
              "A method declaration uses streaming, but \'/capnp/stream.capnp\' is not found in the import path. This is a standard file that should always be installed with the Cap\'n Proto compiler."
              ;
LAB_00130a0f:
              uVar86 = (ulong)uVar91;
              uVar65 = 0;
              if (0x5f < (uint)uVar71) {
                uVar65 = (ulong)*(uint *)(psVar84 + 4);
              }
            }
          }
          (**pEVar68->_vptr_ErrorReporter)(pEVar68,uVar86,uVar65,pcVar75,uVar78);
          pEVar68 = (ErrorReporter *)0x995f9a3377c0b16e;
        }
        else {
          if (sVar3 != 1) {
            if (sVar3 != 0) {
              kj::_::unreachable();
            }
            goto LAB_0012f3b1;
          }
          capnp::_::PointerReader::getStruct
                    ((StructReader *)&local_568,(PointerReader *)&stack0xfffffffffffff758,
                     (word *)0x0);
          aVar72 = aStack_5b4;
          WStack_8a0.field_1.upper32Bits = aStack_5c4.upper32Bits;
          WStack_8a0.offsetAndKind.value = local_5c8.upper32Bits;
          local_898.field_1.upper32Bits = aStack_5bc.upper32Bits;
          local_898.offsetAndKind.value = WStack_5c0.value;
          aStack_88c.upper32Bits = aStack_5b4.upper32Bits;
          aStack_890.upper32Bits = local_5b8.upper32Bits;
          unique0x10007029 = aStack_5ac.upper32Bits;
          local_888 = uStack_5b0;
          unique0x10007051 = SStack_5a4;
          unique0x10007053 = EStack_5a2;
          unique0x10007054 = uStack_5a1;
          iStack_880 = local_5a8;
          auVar12._44_4_ = uStack_59c;
          auVar12._40_4_ = iStack_5a0;
          in_stack_fffffffffffff758.value = 0;
          in_stack_fffffffffffff75c.upper32Bits = 0;
          source_03._reader.pointers._4_4_ = local_568.step;
          source_03._reader.pointers._0_4_ = local_568.elementCount;
          source_03._reader.capTable = local_568.capTable;
          source_03._reader.segment = local_568.segment;
          source_03._reader.data = local_568.ptr;
          source_03._reader.dataSize = local_568.structDataSize;
          source_03._reader.pointerCount = local_568.structPointerCount;
          source_03._reader._38_1_ = local_568.elementSize;
          source_03._reader._39_1_ = local_568._39_1_;
          source_03._reader.nestingLimit = local_568.nestingLimit;
          source_03._reader._44_4_ = local_568._44_4_;
          auVar12._8_4_ = WStack_5c0.value;
          auVar12._12_4_ = aStack_5bc;
          auVar12._0_4_ = local_5c8;
          auVar12._4_4_ = aStack_5c4;
          auVar12._16_4_ = local_5b8;
          auVar12._20_4_ = aStack_5b4;
          auVar12._24_4_ = uStack_5b0;
          auVar12._28_2_ = aStack_5ac._0_2_;
          auVar12._30_2_ = aStack_5ac._2_2_;
          auVar12._32_8_ = _iStack_880;
          auVar12._48_8_ = 0;
          BrandScope::compileDeclExpression
                    ((Maybe<capnp::compiler::BrandedDecl> *)local_6d8,(this->localBrand).ptr,
                     source_03,this->resolver,(ImplicitParams)(auVar12 << 0x40));
          pBVar4 = local_300;
          local_538[0] = local_6d8[0];
          if (local_6d8[0] == true) {
            uStack_530._0_4_ = auStack_6d0._0_4_;
            if (auStack_6d0._0_4_ == 2) {
              local_528._0_4_ = auStack_6d0._8_4_;
              local_528._4_4_ = auStack_6d0._12_4_;
              local_528._8_4_ = auStack_6d0._16_4_;
              local_528._12_4_ = auStack_6d0._20_4_;
            }
            else if (auStack_6d0._0_4_ == 1) {
              local_528._32_4_ = auStack_6d0._40_4_;
              local_528._36_4_ = auStack_6d0._44_4_;
              local_528._16_4_ = auStack_6d0._24_4_;
              local_528._20_2_ = (undefined2)auStack_6d0._28_4_;
              local_528._22_2_ = SUB42(auStack_6d0._28_4_,2);
              local_528._24_4_ = auStack_6d0._32_4_;
              local_528._28_4_ = auStack_6d0._36_4_;
              local_528._0_4_ = auStack_6d0._8_4_;
              local_528._4_4_ = auStack_6d0._12_4_;
              local_528._8_4_ = auStack_6d0._16_4_;
              local_528._12_4_ = auStack_6d0._20_4_;
              local_528.space[0x28] = auStack_6d0[0x30];
              if (auStack_6d0[0x30] == '\x01') {
                local_528._80_8_ = aSStack_690[3]._vptr_StructOrGroup;
                local_528._88_8_ = aSStack_690[4]._vptr_StructOrGroup;
                local_528._64_6_ = SUB86(aSStack_690[1]._vptr_StructOrGroup,0);
                local_528._70_2_ = (undefined2)((ulong)aSStack_690[1]._vptr_StructOrGroup >> 0x30);
                local_528._72_8_ = aSStack_690[2]._vptr_StructOrGroup;
                local_528._48_8_ = auStack_6d0._56_8_;
                local_528._56_6_ = SUB86(aSStack_690[0]._vptr_StructOrGroup,0);
                local_528._62_2_ = (undefined2)((ulong)aSStack_690[0]._vptr_StructOrGroup >> 0x30);
                auStack_6d0._48_8_ = auStack_6d0._48_8_ & 0xffffffffffffff00;
              }
            }
            local_4c8 = (CapTableReader *)local_668._0_8_;
            pBStack_4c0 = (BrandScope *)local_668._8_8_;
            uVar78 = *local_2f8;
            uVar93 = local_2f8[1];
            uVar94 = local_2f8[2];
            uVar8 = local_2f8[3];
            uVar9 = local_2f8[5];
            *(undefined8 *)((long)&(local_300->body).field_1 + 0x18) = local_2f8[4];
            *(undefined8 *)((long)&(pBVar4->body).field_1 + 0x20) = uVar9;
            *(undefined8 *)((long)&(pBVar4->body).field_1 + 8) = uVar94;
            *(undefined8 *)((long)&(pBVar4->body).field_1 + 0x10) = uVar8;
            *(undefined8 *)&pBVar4->body = uVar78;
            *(undefined8 *)&(pBVar4->body).field_1 = uVar93;
            BrandedDecl::getKind((BrandedDecl *)&uStack_530);
            pBVar69 = pBStack_4c0;
            if (local_6d8[0] != true) {
              uVar65 = 0;
              if ((uint)local_4b8._32_4_ < 0x40) {
                uVar86 = 0;
              }
              else {
                uVar86 = (ulong)*(uint *)(CONCAT44(local_4b8._20_4_,local_4b8._16_4_) + 4);
                if (0x9f < (uint)local_4b8._32_4_) {
                  uVar65 = (ulong)*(uint *)(CONCAT44(local_4b8._20_4_,local_4b8._16_4_) + 0x10);
                }
              }
              (**this->errorReporter->_vptr_ErrorReporter)
                        (this->errorReporter,uVar86,uVar65,
                         "Cannot use generic parameter as whole input or output of a method. Instead, use a parameter/result list containing a field with this type."
                         ,0x8b);
              goto LAB_00130c32;
            }
            if (local_6d8._2_2_ != 5) {
              if (bVar89) {
                WStack_8a0.offsetAndKind.value = 0;
                WStack_8a0.field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)0x0;
                local_898.offsetAndKind.value = 0;
                local_898.field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)0x0;
                aStack_890 = (anon_union_4_5_35ddcec3_for_WirePointer_1)0x7fffffff;
                in_stack_fffffffffffff758.value = 0;
                in_stack_fffffffffffff75c.upper32Bits = 0;
              }
              else {
                local_898._2_6_ = iVar97;
                local_898.offsetAndKind.value._0_2_ = uVar95;
                WStack_8a0 = WVar63;
                aStack_890 = (anon_union_4_5_35ddcec3_for_WirePointer_1)(uint)local_740;
                in_stack_fffffffffffff758.value = WVar80.value;
                in_stack_fffffffffffff75c = aVar98;
              }
              pEVar68 = this->errorReporter;
              aStack_88c.upper32Bits = aVar72.upper32Bits;
              capnp::_::PointerReader::getStruct
                        ((StructReader *)local_6d8,(PointerReader *)&stack0xfffffffffffff758,
                         (word *)0x0);
              local_868._18_6_ = iVar97;
              local_868._16_2_ = uVar95;
              if (bVar89) {
                local_868._8_4_ = 0;
                local_868._12_4_ = (anon_union_4_5_35ddcec3_for_WirePointer_1)0x0;
                local_868._16_4_ = 0;
                local_868._20_4_ = (anon_union_4_5_35ddcec3_for_WirePointer_1)0x0;
                local_868._0_4_ = 0;
                local_868._4_4_ = (anon_union_4_5_35ddcec3_for_WirePointer_1)0x0;
                WVar40.value = 0x7fffffff;
              }
              else {
                local_868._4_4_ = aVar98.upper32Bits;
                local_868._0_4_ = WVar80.value;
                local_868._8_8_ = WVar63;
                WVar40.value = (uint)local_740;
              }
              local_868._24_4_ = WVar40.value;
              capnp::_::PointerReader::getStruct
                        ((StructReader *)&stack0xfffffffffffff758,(PointerReader *)local_868,
                         (word *)0x0);
              uVar78 = CONCAT44(in_stack_fffffffffffff75c.upper32Bits,
                                in_stack_fffffffffffff758.value);
              name_00._reader.capTable._0_2_ = uVar95;
              name_00._reader.segment = (SegmentReader *)WVar63;
              name_00._reader.capTable._2_6_ = iVar97;
              name_00._reader.data._0_4_ = WVar80.value;
              name_00._reader.data._4_4_ = aVar98.upper32Bits;
              name_00._reader.pointers = (WirePointer *)p_Var100;
              name_00._reader._32_8_ = p_Var62;
              name_00._reader.nestingLimit = in_stack_fffffffffffff758.value;
              name_00._reader._44_4_ = in_stack_fffffffffffff75c.upper32Bits;
              WVar45 = WStack_8a0;
              WVar83 = local_898;
              WVar67 = _aStack_890;
              uVar93 = _local_888;
              uVar94 = _iStack_880;
              expressionString(name_00);
              kj::str<char_const(&)[2],kj::String,char_const(&)[24]>
                        ((String *)local_7a8,(kj *)0x1c0ea5,(char (*) [2])&local_808,
                         (String *)"\' is not a struct type.",(char (*) [24])WVar77);
              WVar77 = (WirePointer)((long)"\n\n" + 2);
              if (WStack_7a0 != (WirePointer)0x0) {
                WVar77 = (WirePointer)local_7a8;
              }
              uVar65 = 0;
              if ((uint)auStack_6d0._24_4_ < 0x40) {
                uVar86 = 0;
              }
              else {
                uVar86 = (ulong)*(uint *)(CONCAT44(auStack_6d0._12_4_,auStack_6d0._8_4_) + 4);
                if (0x9f < (uint)auStack_6d0._24_4_) {
                  uVar65 = (ulong)*(uint *)(CONCAT44(auStack_6d0._12_4_,auStack_6d0._8_4_) + 0x10);
                }
              }
              (**pEVar68->_vptr_ErrorReporter)
                        (pEVar68,uVar86,uVar65,WVar77,
                         (char *)((long)WStack_7a0 + (ulong)(WStack_7a0 == (WirePointer)0x0)));
              WVar77 = WStack_7a0;
              auVar18 = local_7a8;
              if ((WirePointer)local_7a8 != (WirePointer)0x0) {
                local_7a8._0_4_ = 0;
                local_7a8._4_4_ = (anon_union_4_5_35ddcec3_for_WirePointer_1)0x0;
                WStack_7a0.offsetAndKind.value = 0;
                WStack_7a0.field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)0x0;
                (*(code *)**(undefined8 **)local_798)
                          (local_798,auVar18,1,WVar77,WVar77,0,uVar78,WVar45,WVar83,WVar67,uVar93,
                           uVar94);
              }
              pCVar14 = local_808.capTable;
              pSVar48 = local_808.segment;
              if ((WirePointer)local_808.segment != (WirePointer)0x0) {
                local_808.segment = (SegmentBuilder *)0x0;
                local_808.capTable = (CapTableBuilder *)0x0;
                (**(code **)*local_808.data)(local_808.data,pSVar48,1,pCVar14,pCVar14);
              }
              goto LAB_00130c32;
            }
            in_stack_fffffffffffff758.value =
                 CONCAT31((int3)(in_stack_fffffffffffff758.value >> 8),uStack_530._0_4_ == 1);
            if (uStack_530._0_4_ != 1) {
              kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&>
                        ((Fault *)local_6d8,
                         "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compiler/generics.h"
                         ,0x115,FAILED,"body.is<Resolver::ResolvedDecl>()","_kjCondition,",
                         (DebugExpression<bool> *)&stack0xfffffffffffff758);
              kj::_::Debug::Fault::fatal((Fault *)local_6d8);
            }
            local_838.segment = (SegmentBuilder *)0x0;
            local_838.capTable = (CapTableBuilder *)0x0;
            local_838.data = (void *)0x0;
            local_838.pointers = (WirePointer *)&kj::NullArrayDisposer::instance;
            WVar54.offsetAndKind.value = 0;
            WVar54.field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)0x0;
            pBVar70 = pBStack_4c0;
            do {
              if (((pBVar70->params).size_ != 0) ||
                 ((pBVar70->inherited == true && (pBVar70->leafParamCount != 0)))) {
                if (WVar54 == (WirePointer)local_838.data) {
                  sVar73 = (long)WVar54 - (long)local_838.segment >> 2;
                  if (WVar54 == (WirePointer)local_838.segment) {
                    sVar73 = 4;
                  }
                  kj::Vector<capnp::compiler::BrandScope_*>::setCapacity
                            ((Vector<capnp::compiler::BrandScope_*> *)&local_838,sVar73);
                  WVar54 = (WirePointer)local_838.capTable;
                }
                *(BrandScope **)WVar54 = pBVar70;
                WVar54 = (WirePointer)((long)local_838.capTable + 8);
                local_838.capTable = (CapTableBuilder *)WVar54;
              }
              pBVar70 = (pBVar70->parent).ptr.ptr;
            } while (pBVar70 != (BrandScope *)0x0);
            if (WVar54 != (WirePointer)local_838.segment) {
              local_868._16_8_ = local_328.pointers + 3;
              local_868._0_8_ = local_328.segment;
              local_868._8_8_ = local_328.capTable;
              capnp::_::PointerBuilder::initStruct
                        ((StructBuilder *)&stack0xfffffffffffff758,(PointerBuilder *)local_868,
                         (StructSize)0x10000);
              local_868._4_4_ = in_stack_fffffffffffff75c.upper32Bits;
              local_868._0_4_ = in_stack_fffffffffffff758.value;
              local_868._8_8_ = WStack_8a0;
              local_868._16_8_ = _aStack_890;
              capnp::_::PointerBuilder::initStructList
                        ((ListBuilder *)local_6d8,(PointerBuilder *)local_868,
                         (ElementCount)
                         ((ulong)((long)local_838.capTable - (long)local_838.segment) >> 3),
                         (StructSize)0x10002);
              lVar42 = (long)local_838.capTable - (long)local_838.segment;
              if (lVar42 != 0) {
                uVar65 = lVar42 >> 3;
                uVar86 = 0;
                uVar95 = (undefined2)uVar65;
                iVar97 = (int6)(lVar42 >> 0x13);
                do {
                  capnp::_::ListBuilder::getStructElement
                            ((StructBuilder *)&stack0xfffffffffffff758,(ListBuilder *)local_6d8,
                             (ElementCount)uVar86);
                  uVar82 = uVar86 & 0xffffffff;
                  lVar42 = *(long *)((long)local_838.segment + uVar82 * 8);
                  *(WirePointer *)local_898 = *(WirePointer *)(lVar42 + 0x28);
                  if (*(char *)(lVar42 + 0x34) == '\x01') {
                    *(undefined2 *)&(((WirePointer *)((long)local_898 + 8))->offsetAndKind).value =
                         1;
                  }
                  else {
                    EVar87 = *(ElementCount *)(lVar42 + 0x40);
                    *(undefined2 *)&(((WirePointer *)((long)local_898 + 8))->offsetAndKind).value =
                         0;
                    local_808.segment._4_4_ = in_stack_fffffffffffff75c.upper32Bits;
                    local_808.segment._0_4_ = in_stack_fffffffffffff758.value;
                    local_808.capTable = (CapTableBuilder *)WStack_8a0;
                    local_808.data = (void *)_aStack_890;
                    capnp::_::PointerBuilder::initStructList
                              ((ListBuilder *)local_868,(PointerBuilder *)&local_808,EVar87,
                               (StructSize)0x10001);
                    uVar65 = local_868._24_8_ & 0xffffffff;
                    if (uVar65 != 0) {
                      lVar42 = 0;
                      uVar88 = 0;
                      do {
                        lVar6 = *(long *)(*(long *)((long)local_838.segment + uVar82 * 8) + 0x38);
                        pEVar68 = pBVar69->errorReporter;
                        capnp::_::ListBuilder::getStructElement
                                  (&local_808,(ListBuilder *)local_868,(ElementCount)uVar88);
                        *(undefined2 *)local_808.data = 1;
                        local_768._0_8_ = local_808.segment;
                        local_768._8_8_ = local_808.capTable;
                        local_768._16_8_ = local_808.pointers;
                        capnp::_::PointerBuilder::initStruct
                                  ((StructBuilder *)local_7a8,(PointerBuilder *)local_768,
                                   (StructSize)0x10003);
                        target_03._builder.pointers._4_4_ = BStack_78c;
                        target_03._builder.pointers._0_4_ = aStack_790.upper32Bits;
                        target_03._builder.capTable = (CapTableBuilder *)WStack_7a0;
                        target_03._builder.segment = (SegmentBuilder *)local_7a8;
                        target_03._builder.data = (void *)local_798;
                        target_03._builder.dataSize = local_788;
                        target_03._builder.pointerCount = SStack_784;
                        target_03._builder._38_1_ = EStack_782;
                        target_03._builder._39_1_ = uStack_781;
                        BrandedDecl::compileAsType
                                  ((BrandedDecl *)(lVar6 + lVar42),pEVar68,target_03);
                        uVar88 = uVar88 + 1;
                        lVar42 = lVar42 + 0xa8;
                      } while (uVar65 != uVar88);
                    }
                    uVar65 = CONCAT62(iVar97,uVar95);
                  }
                  uVar86 = uVar86 + 1;
                } while (uVar86 != uVar65);
              }
            }
            pvVar15 = local_838.data;
            pCVar14 = local_838.capTable;
            pSVar48 = local_838.segment;
            if ((WirePointer)local_838.segment != (WirePointer)0x0) {
              local_838.segment = (SegmentBuilder *)0x0;
              local_838.capTable = (CapTableBuilder *)0x0;
              local_838.data = (void *)0x0;
              (**(code **)*local_838.pointers)
                        (local_838.pointers,pSVar48,8,(long)pCVar14 - (long)pSVar48 >> 3,
                         (long)pvVar15 - (long)pSVar48 >> 3);
            }
            pEVar68 = (ErrorReporter *)CONCAT44(local_528._4_4_,local_528._0_4_);
          }
          else {
LAB_00130c32:
            pEVar68 = (ErrorReporter *)0x0;
          }
          if ((local_538[0] == '\x01') && (pBStack_4c0 != (BrandScope *)0x0)) {
            pBStack_4c0 = (BrandScope *)0x0;
            (**local_4c8->_vptr_CapTableReader)();
          }
        }
      }
LAB_00130c6b:
      p_Var36 = local_2a0;
      EVar87 = local_5cc;
      *(ErrorReporter **)((long)local_328.data + 0x10) = pEVar68;
      if ((ushort)local_7d0 < 4) {
        local_528._8_4_ = 0x7fffffff;
        p_Var62 = (_Base_ptr)0x0;
        pp_Var43 = (_Base_ptr *)0x0;
        local_538 = (undefined1  [8])0x0;
      }
      else {
        pp_Var43 = &p_Var100->_M_right;
        local_538 = (undefined1  [8])local_7e0;
        local_528._8_4_ = local_7d8._0_4_;
      }
      uStack_530._0_4_ = SUB84(p_Var62,0);
      uStack_530._4_4_ = SUB84((ulong)p_Var62 >> 0x20,0);
      local_528._0_4_ = SUB84(pp_Var43,0);
      local_528._4_4_ = (undefined4)((ulong)pp_Var43 >> 0x20);
      capnp::_::PointerReader::getList
                (&local_130,(PointerReader *)local_538,INLINE_COMPOSITE,(word *)0x0);
      annotations.reader.capTable = local_130.capTable;
      annotations.reader.segment = local_130.segment;
      annotations.reader.ptr = local_130.ptr;
      annotations.reader.elementCount = local_130.elementCount;
      annotations.reader.step = local_130.step;
      annotations.reader.structDataSize = local_130.structDataSize;
      annotations.reader.structPointerCount = local_130.structPointerCount;
      annotations.reader.elementSize = local_130.elementSize;
      annotations.reader._39_1_ = local_130._39_1_;
      annotations.reader.nestingLimit = local_130.nestingLimit;
      annotations.reader._44_4_ = local_130._44_4_;
      targetsFlagName.content.size_ = 0xe;
      targetsFlagName.content.ptr = "targetsMethod";
      compileAnnotationApplications
                ((Orphan<capnp::List<capnp::schema::Annotation,_(capnp::Kind)3>_> *)local_6d8,this,
                 annotations,targetsFlagName);
      local_528._0_8_ = local_328.pointers + 1;
      local_538 = (undefined1  [8])local_328.segment;
      uStack_530._0_4_ = (uint32_t)local_328.capTable;
      uStack_530._4_4_ = (uint32_t)((ulong)local_328.capTable >> 0x20);
      capnp::_::PointerBuilder::adopt((PointerBuilder *)local_538,(OrphanBuilder *)local_6d8);
      if (CONCAT44(auStack_6d0._4_4_,auStack_6d0._0_4_) != 0) {
        capnp::_::OrphanBuilder::euthanize((OrphanBuilder *)local_6d8);
      }
      EVar87 = EVar87 + 1;
      p_Var55 = (_Base_ptr)std::_Rb_tree_increment(p_Var36);
    } while (p_Var55 != &_Stack_290);
  }
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::pair<unsigned_int,_capnp::compiler::Declaration::Reader>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::pair<unsigned_int,_capnp::compiler::Declaration::Reader>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::pair<unsigned_int,_capnp::compiler::Declaration::Reader>_>_>_>
  ::~_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::pair<unsigned_int,_capnp::compiler::Declaration::Reader>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::pair<unsigned_int,_capnp::compiler::Declaration::Reader>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::pair<unsigned_int,_capnp::compiler::Declaration::Reader>_>_>_>
               *)local_298);
  return;
}

Assistant:

void NodeTranslator::compileInterface(Declaration::Interface::Reader decl,
                                      List<Declaration>::Reader members,
                                      schema::Node::Builder builder) {
  auto interfaceBuilder = builder.initInterface();

  auto superclassesDecl = decl.getSuperclasses();
  auto superclassesBuilder = interfaceBuilder.initSuperclasses(superclassesDecl.size());
  for (uint i: kj::indices(superclassesDecl)) {
    auto superclass = superclassesDecl[i];

    KJ_IF_SOME(decl, compileDeclExpression(superclass, ImplicitParams::none())) {
      KJ_IF_SOME(kind, decl.getKind()) {
        if (kind == Declaration::INTERFACE) {
          auto s = superclassesBuilder[i];
          s.setId(decl.getIdAndFillBrand([&]() { return s.initBrand(); }));
        } else {
          decl.addError(errorReporter, kj::str(
            "'", decl.toString(), "' is not an interface."));
        }
      } else {
        // A variable?
        decl.addError(errorReporter, kj::str(
            "'", decl.toString(), "' is an unbound generic parameter. Currently we don't support "
            "extending these."));
      }
    }
  }